

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx2::forward_fp16
          (InnerProduct_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  ulong uVar2;
  undefined4 uVar3;
  int *piVar4;
  void *pvVar5;
  _func_int **pp_Var6;
  void *pvVar7;
  _func_int *p_Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [24];
  undefined8 uVar16;
  undefined4 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 (*pauVar22) [32];
  int iVar23;
  uint uVar24;
  uint uVar25;
  undefined1 (*pauVar26) [16];
  ulong uVar27;
  long lVar28;
  undefined1 (*pauVar29) [32];
  long lVar30;
  void *pvVar31;
  void *pvVar32;
  void *pvVar33;
  undefined1 (*pauVar34) [16];
  uint uVar35;
  void *pvVar36;
  ulong uVar37;
  void *pvVar38;
  void *pvVar39;
  void *pvVar40;
  uint uVar41;
  void *pvVar42;
  void *pvVar43;
  void *pvVar44;
  void *pvVar45;
  void *pvVar46;
  int iVar47;
  void *pvVar48;
  void *pvVar49;
  undefined1 (*pauVar50) [16];
  void *pvVar51;
  void *pvVar52;
  ulong uVar53;
  undefined1 (*pauVar54) [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar58 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [28];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  float fVar92;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  float _m_f [8];
  Option opt_flatten;
  undefined1 (*local_198) [32];
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  int local_180;
  Allocator *local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  int local_160;
  size_t local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [32];
  void *local_110;
  ulong local_108;
  long local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  void *local_c0;
  undefined1 local_b8 [16];
  undefined1 auStack_a8 [16];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [40];
  float fVar57;
  float fVar72;
  
  piVar4 = bottom_blob->refcount;
  local_198 = (undefined1 (*) [32])bottom_blob->data;
  uStack_190 = SUB84(bottom_blob->refcount,0);
  uStack_18c = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_188 = (undefined4)bottom_blob->elemsize;
  uStack_184 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_180 = bottom_blob->elempack;
  local_178 = bottom_blob->allocator;
  local_170._0_4_ = bottom_blob->dims;
  local_170._4_4_ = bottom_blob->w;
  uStack_168._0_4_ = bottom_blob->h;
  uStack_168._4_4_ = bottom_blob->d;
  local_160 = bottom_blob->c;
  local_158 = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (bottom_blob->dims != 1) {
    auVar15[0] = opt->lightmode;
    auVar15._1_3_ = *(undefined3 *)&opt->field_0x1;
    auVar15._4_4_ = opt->num_threads;
    auVar15._8_8_ = opt->blob_allocator;
    auVar15._16_8_ = opt->workspace_allocator;
    uVar16 = opt->workspace_allocator;
    uVar17 = opt->openmp_blocktime;
    uVar18 = opt->use_winograd_convolution;
    uVar19 = opt->use_sgemm_convolution;
    uVar20 = opt->use_int8_inference;
    uVar21 = opt->use_vulkan_compute;
    auStack_a8[0xf] = uVar21;
    auStack_a8[0xe] = uVar20;
    auStack_a8[0xd] = uVar19;
    auStack_a8[0xc] = uVar18;
    auStack_a8._8_4_ = uVar17;
    auStack_a8._0_8_ = uVar16;
    local_98[0] = opt->use_bf16_storage;
    local_98[1] = opt->use_fp16_packed;
    local_98[2] = opt->use_fp16_storage;
    local_98[3] = opt->use_fp16_arithmetic;
    local_98[4] = opt->use_int8_packed;
    local_98[5] = opt->use_int8_storage;
    local_98[6] = opt->use_int8_arithmetic;
    local_98[7] = opt->use_packing_layout;
    local_98[8] = opt->use_shader_pack8;
    local_98[9] = opt->use_subgroup_basic;
    local_98[10] = opt->use_subgroup_vote;
    local_98[0xb] = opt->use_subgroup_ballot;
    local_98[0xc] = opt->use_subgroup_shuffle;
    local_98[0xd] = opt->use_image_storage;
    local_98[0xe] = opt->use_tensor_storage;
    local_98[0xf] = opt->use_weight_fp16_storage;
    local_98._16_4_ = opt->flush_denormals;
    local_98[0x14] = opt->use_local_pool_allocator;
    local_98[0x15] = opt->use_reserved_1;
    local_98[0x16] = opt->use_reserved_2;
    local_98[0x17] = opt->use_reserved_3;
    local_98[0x18] = opt->use_reserved_4;
    local_98[0x19] = opt->use_reserved_5;
    local_98[0x1a] = opt->use_reserved_6;
    local_98[0x1b] = opt->use_reserved_7;
    local_98[0x1c] = opt->use_reserved_8;
    local_98[0x1d] = opt->use_reserved_9;
    local_98[0x1e] = opt->use_reserved_10;
    local_98[0x1f] = opt->use_reserved_11;
    local_b8._0_8_ = auVar15._0_8_;
    local_b8._8_8_ = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_198);
  }
  iVar23 = local_170._4_4_ * local_180;
  local_170 = CONCAT44(iVar23,(undefined4)local_170);
  local_158 = (size_t)iVar23;
  local_188 = 4;
  uStack_184 = 0;
  local_180 = 1;
  uVar24 = iVar23 * (int)uStack_168;
  Mat::create(top_blob,*(int *)(this->_vptr_InnerProduct_x86_avx2[-3] + 0x28 +
                               (long)&(this->weight_data_int8).data),4,opt->blob_allocator);
  pauVar22 = local_198;
  pvVar5 = top_blob->data;
  iVar23 = -100;
  if ((pvVar5 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    pp_Var6 = this->_vptr_InnerProduct_x86_avx2;
    pvVar7 = (this->weight_data_fp16).data;
    uVar25 = *(int *)(pp_Var6[-3] + 0x28 + (long)&(this->weight_data_int8).data) >> 3;
    uVar27 = (long)*(int *)(pp_Var6[-3] + 0x28 + (long)&(this->weight_data_int8).data) &
             0xfffffffffffffff8;
    lVar28 = (long)(int)uVar24;
    local_148._0_8_ = pp_Var6;
    uVar41 = (int)uVar24 >> 3;
    if (0 < (int)uVar25) {
      local_e8 = (ulong)uVar41;
      local_f0 = (ulong)(uVar24 & 7);
      local_f8 = (ulong)uVar25;
      local_100 = lVar28 * 0x10;
      pvVar38 = (void *)(lVar28 * 2 + (long)pvVar7);
      pvVar44 = (void *)((long)pvVar7 + lVar28 * 4);
      pvVar46 = (void *)((long)pvVar7 + lVar28 * 6);
      pvVar52 = (void *)((long)pvVar7 + lVar28 * 8);
      pvVar33 = (void *)((long)pvVar7 + lVar28 * 10);
      pvVar40 = (void *)((long)pvVar7 + lVar28 * 0xc);
      pvVar42 = (void *)(lVar28 * 0xe + (long)pvVar7);
      local_108 = (ulong)((uVar24 & 7) * 2);
      uVar37 = 0;
      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar177 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar83._8_4_ = 0x3f800000;
      auVar83._0_8_ = 0x3f8000003f800000;
      auVar83._12_4_ = 0x3f800000;
      auVar83._16_4_ = 0x3f800000;
      auVar83._20_4_ = 0x3f800000;
      auVar83._24_4_ = 0x3f800000;
      auVar83._28_4_ = 0x3f800000;
      auVar102._8_4_ = 0xbf800000;
      auVar102._0_8_ = 0xbf800000bf800000;
      auVar102._12_4_ = 0xbf800000;
      auVar102._16_4_ = 0xbf800000;
      auVar102._20_4_ = 0xbf800000;
      auVar102._24_4_ = 0xbf800000;
      auVar102._28_4_ = 0xbf800000;
      pvVar49 = pvVar7;
      do {
        uVar2 = local_108;
        local_e0 = uVar37 * 8;
        fVar120 = 0.0;
        fVar121 = 0.0;
        fVar57 = 0.0;
        fVar72 = 0.0;
        fVar92 = 0.0;
        fVar122 = 0.0;
        fVar123 = 0.0;
        fVar124 = 0.0;
        if (*(int *)(pp_Var6[-3] + 0x2c + (long)&(this->weight_data_int8).data) != 0) {
          pfVar1 = (float *)(*(long *)(&this->field_0x178 + (long)pp_Var6[-3]) + uVar37 * 0x20);
          fVar57 = *pfVar1;
          fVar72 = pfVar1[1];
          fVar120 = pfVar1[2];
          fVar121 = pfVar1[3];
          fVar92 = pfVar1[4];
          fVar122 = pfVar1[5];
          fVar123 = pfVar1[6];
          fVar124 = pfVar1[7];
        }
        pauVar29 = local_198;
        if ((int)local_e8 < 1) {
          pvVar51 = (void *)((long)pvVar7 + local_e0 * lVar28 * 2);
          pvVar48 = (void *)((long)pvVar7 + (local_e0 | 1) * lVar28 * 2);
          pvVar32 = (void *)((long)pvVar7 + (local_e0 | 2) * lVar28 * 2);
          pvVar39 = (void *)((long)pvVar7 + (local_e0 | 3) * lVar28 * 2);
          pvVar36 = (void *)((long)pvVar7 + (local_e0 | 4) * lVar28 * 2);
          pvVar43 = (void *)((long)pvVar7 + (local_e0 | 5) * lVar28 * 2);
          pvVar45 = (void *)((long)pvVar7 + (local_e0 | 6) * lVar28 * 2);
          pvVar31 = (void *)((long)pvVar7 + (local_e0 | 7) * lVar28 * 2);
          auVar178 = SUB6432(ZEXT864(0),0);
          auVar75 = SUB6432(ZEXT864(0),0);
          auVar116 = ZEXT832(0);
          auVar61 = ZEXT832(0);
          auVar93 = ZEXT832(0);
          auVar133 = SUB6432(ZEXT864(0),0);
          auVar58 = ZEXT816(0);
          auVar192 = SUB6432(ZEXT864(0),0);
          local_110 = pvVar38;
        }
        else {
          auVar194 = ZEXT864(0);
          lVar30 = 0;
          auVar105 = ZEXT864(0);
          auVar161 = ZEXT864(0);
          auVar143 = ZEXT864(0);
          auVar91 = ZEXT864(0);
          auVar71 = ZEXT864(0);
          auVar191 = ZEXT864(0);
          auVar183 = ZEXT864(0);
          iVar23 = uVar41 + 1;
          do {
            auVar192 = *(undefined1 (*) [32])(*local_198 + lVar30 * 2);
            auVar58 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar49 + lVar30));
            auVar116 = vcvtph2ps_f16c(auVar58);
            auVar58 = vfmadd231ps_fma(auVar183._0_32_,auVar192,auVar116);
            auVar183 = ZEXT1664(auVar58);
            auVar178 = ZEXT1632(auVar58);
            auVar58 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar38 + lVar30));
            auVar116 = vcvtph2ps_f16c(auVar58);
            auVar58 = vfmadd231ps_fma(auVar191._0_32_,auVar192,auVar116);
            auVar191 = ZEXT1664(auVar58);
            auVar75 = ZEXT1632(auVar58);
            auVar58 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar44 + lVar30));
            auVar116 = vcvtph2ps_f16c(auVar58);
            auVar58 = vfmadd231ps_fma(auVar71._0_32_,auVar192,auVar116);
            auVar71 = ZEXT1664(auVar58);
            auVar116 = ZEXT1632(auVar58);
            auVar58 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar46 + lVar30));
            auVar61 = vcvtph2ps_f16c(auVar58);
            auVar58 = vfmadd231ps_fma(auVar91._0_32_,auVar192,auVar61);
            auVar91 = ZEXT1664(auVar58);
            auVar61 = ZEXT1632(auVar58);
            auVar58 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar52 + lVar30));
            auVar93 = vcvtph2ps_f16c(auVar58);
            auVar58 = vfmadd231ps_fma(auVar143._0_32_,auVar192,auVar93);
            auVar143 = ZEXT1664(auVar58);
            auVar93 = ZEXT1632(auVar58);
            auVar58 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar33 + lVar30));
            auVar133 = vcvtph2ps_f16c(auVar58);
            auVar58 = vfmadd231ps_fma(auVar161._0_32_,auVar192,auVar133);
            auVar161 = ZEXT1664(auVar58);
            auVar133 = ZEXT1632(auVar58);
            auVar58 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar40 + lVar30));
            auVar76 = vcvtph2ps_f16c(auVar58);
            auVar58 = vfmadd231ps_fma(auVar105._0_32_,auVar192,auVar76);
            auVar105 = ZEXT1664(auVar58);
            auVar59 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar42 + lVar30));
            auVar76 = vcvtph2ps_f16c(auVar59);
            auVar59 = vfmadd231ps_fma(auVar194._0_32_,auVar192,auVar76);
            auVar194 = ZEXT1664(auVar59);
            auVar192 = ZEXT1632(auVar59);
            pauVar29 = pauVar29 + 1;
            lVar30 = lVar30 + 0x10;
            iVar23 = iVar23 + -1;
          } while (1 < iVar23);
          pvVar51 = (void *)(lVar30 + (long)pvVar49);
          pvVar48 = (void *)((long)pvVar38 + lVar30);
          pvVar32 = (void *)((long)pvVar44 + lVar30);
          pvVar39 = (void *)((long)pvVar46 + lVar30);
          pvVar36 = (void *)((long)pvVar52 + lVar30);
          pvVar43 = (void *)((long)pvVar33 + lVar30);
          pvVar45 = (void *)((long)pvVar40 + lVar30);
          pvVar31 = (void *)(lVar30 + (long)pvVar42);
        }
        auVar77 = ZEXT1632(auVar58);
        auVar76 = auVar56._0_32_;
        local_d8 = pvVar40;
        local_d0 = pvVar33;
        local_c8 = pvVar52;
        local_c0 = pvVar46;
        if ((int)local_f0 != 0) {
          uVar53 = 0;
          local_138 = auVar76;
          _local_b8 = auVar76;
          local_98 = auVar76;
          local_78 = auVar76;
          local_58._0_32_ = auVar76;
          do {
            *(undefined4 *)(local_138 + uVar53 * 2) = *(undefined4 *)(*pauVar29 + uVar53 * 2);
            *(undefined2 *)(local_b8 + uVar53) = *(undefined2 *)((long)pvVar51 + uVar53);
            *(undefined2 *)(local_b8 + uVar53 + 0x10) = *(undefined2 *)((long)pvVar48 + uVar53);
            *(undefined2 *)(local_98 + uVar53) = *(undefined2 *)((long)pvVar32 + uVar53);
            *(undefined2 *)(local_98 + uVar53 + 0x10) = *(undefined2 *)((long)pvVar39 + uVar53);
            *(undefined2 *)(local_78 + uVar53) = *(undefined2 *)((long)pvVar36 + uVar53);
            *(undefined2 *)(local_78 + uVar53 + 0x10) = *(undefined2 *)((long)pvVar43 + uVar53);
            *(undefined2 *)(local_58 + uVar53) = *(undefined2 *)((long)pvVar45 + uVar53);
            *(undefined2 *)(local_58 + uVar53 + 0x10) = *(undefined2 *)((long)pvVar31 + uVar53);
            uVar53 = uVar53 + 2;
          } while (uVar2 != uVar53);
          auVar58 = vlddqu_avx(local_b8);
          auVar94 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar178,local_138,auVar94);
          auVar178 = ZEXT1632(auVar58);
          auVar58 = vlddqu_avx(auStack_a8);
          auVar94 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar75,local_138,auVar94);
          auVar75 = ZEXT1632(auVar58);
          auVar58 = vlddqu_avx(local_98._0_16_);
          auVar94 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar116,local_138,auVar94);
          auVar116 = ZEXT1632(auVar58);
          auVar58 = vlddqu_avx(local_98._16_16_);
          auVar94 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar61,local_138,auVar94);
          auVar61 = ZEXT1632(auVar58);
          auVar58 = vlddqu_avx(local_78._0_16_);
          auVar94 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar93,local_138,auVar94);
          auVar93 = ZEXT1632(auVar58);
          auVar58 = vlddqu_avx(local_78._16_16_);
          auVar94 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar133,local_138,auVar94);
          auVar133 = ZEXT1632(auVar58);
          auVar58 = vlddqu_avx(local_58._0_16_);
          auVar94 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar77,local_138,auVar94);
          auVar77 = ZEXT1632(auVar58);
          auVar58 = vlddqu_avx(local_58._16_16_);
          auVar94 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar192,local_138,auVar94);
          auVar192 = ZEXT1632(auVar58);
        }
        auVar192 = vhaddps_avx(auVar77,auVar192);
        auVar93 = vhaddps_avx(auVar93,auVar133);
        auVar93 = vhaddps_avx(auVar93,auVar192);
        auVar116 = vhaddps_avx(auVar116,auVar61);
        auVar61 = vhaddps_avx(auVar178,auVar75);
        auVar61 = vhaddps_avx(auVar61,auVar116);
        auVar116 = vblendps_avx(auVar61,auVar93,0xf0);
        auVar93 = vperm2f128_avx(auVar61,auVar93,0x21);
        fVar57 = auVar93._0_4_ + fVar57 + auVar116._0_4_;
        fVar72 = auVar93._4_4_ + fVar72 + auVar116._4_4_;
        auVar61._0_8_ = CONCAT44(fVar72,fVar57);
        auVar61._8_4_ = auVar93._8_4_ + fVar120 + auVar116._8_4_;
        auVar61._12_4_ = auVar93._12_4_ + fVar121 + auVar116._12_4_;
        auVar61._16_4_ = auVar93._16_4_ + fVar92 + auVar116._16_4_;
        auVar61._20_4_ = auVar93._20_4_ + fVar122 + auVar116._20_4_;
        auVar61._24_4_ = auVar93._24_4_ + fVar123 + auVar116._24_4_;
        auVar61._28_4_ = auVar93._28_4_ + fVar124 + auVar116._28_4_;
        p_Var8 = pp_Var6[-3];
        auVar116 = auVar177._0_32_;
        switch(*(undefined4 *)(p_Var8 + 0x38 + (long)&(this->weight_data_int8).data)) {
        case 1:
          auVar61 = vmaxps_avx(auVar61,auVar76);
          break;
        case 2:
          auVar116 = vmaxps_avx(auVar61,auVar76);
          auVar61 = vminps_avx(auVar61,auVar76);
          uVar3 = **(undefined4 **)(p_Var8 + 0x40 + (long)&(this->weight_data_int8).data);
          auVar64._4_4_ = uVar3;
          auVar64._0_4_ = uVar3;
          auVar64._8_4_ = uVar3;
          auVar64._12_4_ = uVar3;
          auVar64._16_4_ = uVar3;
          auVar64._20_4_ = uVar3;
          auVar64._24_4_ = uVar3;
          auVar64._28_4_ = uVar3;
          auVar58 = vfmadd213ps_fma(auVar64,auVar61,auVar116);
          auVar61 = ZEXT1632(auVar58);
          break;
        case 3:
          uVar3 = **(undefined4 **)(p_Var8 + 0x40 + (long)&(this->weight_data_int8).data);
          auVar78._4_4_ = uVar3;
          auVar78._0_4_ = uVar3;
          auVar78._8_4_ = uVar3;
          auVar78._12_4_ = uVar3;
          auVar78._16_4_ = uVar3;
          auVar78._20_4_ = uVar3;
          auVar78._24_4_ = uVar3;
          auVar78._28_4_ = uVar3;
          uVar3 = (*(undefined4 **)(p_Var8 + 0x40 + (long)&(this->weight_data_int8).data))[1];
          auVar95._4_4_ = uVar3;
          auVar95._0_4_ = uVar3;
          auVar95._8_4_ = uVar3;
          auVar95._12_4_ = uVar3;
          auVar95._16_4_ = uVar3;
          auVar95._20_4_ = uVar3;
          auVar95._24_4_ = uVar3;
          auVar95._28_4_ = uVar3;
          auVar116 = vmaxps_avx(auVar61,auVar78);
          auVar61 = vminps_avx(auVar116,auVar95);
          break;
        case 4:
          auVar62._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
          auVar62._8_4_ = -auVar61._8_4_;
          auVar62._12_4_ = -auVar61._12_4_;
          auVar62._16_4_ = -auVar61._16_4_;
          auVar62._20_4_ = -auVar61._20_4_;
          auVar62._24_4_ = -auVar61._24_4_;
          auVar62._28_4_ = -auVar61._28_4_;
          auVar79._8_4_ = 0x42b0c0a5;
          auVar79._0_8_ = 0x42b0c0a542b0c0a5;
          auVar79._12_4_ = 0x42b0c0a5;
          auVar79._16_4_ = 0x42b0c0a5;
          auVar79._20_4_ = 0x42b0c0a5;
          auVar79._24_4_ = 0x42b0c0a5;
          auVar79._28_4_ = 0x42b0c0a5;
          auVar61 = vminps_avx(auVar62,auVar79);
          auVar80._8_4_ = 0xc2b0c0a5;
          auVar80._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar80._12_4_ = 0xc2b0c0a5;
          auVar80._16_4_ = 0xc2b0c0a5;
          auVar80._20_4_ = 0xc2b0c0a5;
          auVar80._24_4_ = 0xc2b0c0a5;
          auVar80._28_4_ = 0xc2b0c0a5;
          auVar93 = vmaxps_avx(auVar61,auVar80);
          auVar81._8_4_ = 0x3fb8aa3b;
          auVar81._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar81._12_4_ = 0x3fb8aa3b;
          auVar81._16_4_ = 0x3fb8aa3b;
          auVar81._20_4_ = 0x3fb8aa3b;
          auVar81._24_4_ = 0x3fb8aa3b;
          auVar81._28_4_ = 0x3fb8aa3b;
          auVar58 = vfmadd213ps_fma(auVar81,auVar93,auVar116);
          auVar133 = vroundps_avx(ZEXT1632(auVar58),1);
          auVar61 = vcmpps_avx(ZEXT1632(auVar58),auVar133,1);
          auVar61 = vandps_avx(auVar61,auVar83);
          auVar61 = vsubps_avx(auVar133,auVar61);
          auVar96._8_4_ = 0xbf317218;
          auVar96._0_8_ = 0xbf317218bf317218;
          auVar96._12_4_ = 0xbf317218;
          auVar96._16_4_ = 0xbf317218;
          auVar96._20_4_ = 0xbf317218;
          auVar96._24_4_ = 0xbf317218;
          auVar96._28_4_ = 0xbf317218;
          auVar59 = vfmadd231ps_fma(auVar93,auVar61,auVar96);
          auVar93 = ZEXT1632(auVar59);
          fVar57 = auVar59._0_4_;
          fVar72 = auVar59._4_4_;
          fVar120 = auVar59._8_4_;
          fVar121 = auVar59._12_4_;
          auVar9._28_4_ = 0xbf317218;
          auVar9._0_28_ =
               ZEXT1628(CONCAT412(fVar121 * fVar121,
                                  CONCAT48(fVar120 * fVar120,
                                           CONCAT44(fVar72 * fVar72,fVar57 * fVar57))));
          auVar117._8_4_ = 0x39506967;
          auVar117._0_8_ = 0x3950696739506967;
          auVar117._12_4_ = 0x39506967;
          auVar117._16_4_ = 0x39506967;
          auVar117._20_4_ = 0x39506967;
          auVar117._24_4_ = 0x39506967;
          auVar117._28_4_ = 0x39506967;
          auVar135._8_4_ = 0x3ab743ce;
          auVar135._0_8_ = 0x3ab743ce3ab743ce;
          auVar135._12_4_ = 0x3ab743ce;
          auVar135._16_4_ = 0x3ab743ce;
          auVar135._20_4_ = 0x3ab743ce;
          auVar135._24_4_ = 0x3ab743ce;
          auVar135._28_4_ = 0x3ab743ce;
          auVar58 = vfmadd213ps_fma(auVar117,auVar93,auVar135);
          auVar136._8_4_ = 0x3c088908;
          auVar136._0_8_ = 0x3c0889083c088908;
          auVar136._12_4_ = 0x3c088908;
          auVar136._16_4_ = 0x3c088908;
          auVar136._20_4_ = 0x3c088908;
          auVar136._24_4_ = 0x3c088908;
          auVar136._28_4_ = 0x3c088908;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar93,auVar136);
          auVar127._8_4_ = 0x3d2aa9c1;
          auVar127._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar127._12_4_ = 0x3d2aa9c1;
          auVar127._16_4_ = 0x3d2aa9c1;
          auVar127._20_4_ = 0x3d2aa9c1;
          auVar127._24_4_ = 0x3d2aa9c1;
          auVar127._28_4_ = 0x3d2aa9c1;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar93,auVar127);
          auVar128._8_4_ = 0x3e2aaaaa;
          auVar128._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar128._12_4_ = 0x3e2aaaaa;
          auVar128._16_4_ = 0x3e2aaaaa;
          auVar128._20_4_ = 0x3e2aaaaa;
          auVar128._24_4_ = 0x3e2aaaaa;
          auVar128._28_4_ = 0x3e2aaaaa;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),ZEXT1632(auVar59),auVar128);
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),ZEXT1632(auVar59),auVar116);
          auVar137._0_4_ = fVar57 + 1.0;
          auVar137._4_4_ = fVar72 + 1.0;
          auVar137._8_4_ = fVar120 + 1.0;
          auVar137._12_4_ = fVar121 + 1.0;
          auVar137._16_4_ = 0x3f800000;
          auVar137._20_4_ = 0x3f800000;
          auVar137._24_4_ = 0x3f800000;
          auVar137._28_4_ = 0x3f800000;
          auVar58 = vfmadd231ps_fma(auVar137,auVar9,ZEXT1632(auVar58));
          auVar63._0_4_ = (int)auVar61._0_4_;
          auVar63._4_4_ = (int)auVar61._4_4_;
          auVar63._8_4_ = (int)auVar61._8_4_;
          auVar63._12_4_ = (int)auVar61._12_4_;
          auVar63._16_4_ = (int)auVar61._16_4_;
          auVar63._20_4_ = (int)auVar61._20_4_;
          auVar63._24_4_ = (int)auVar61._24_4_;
          auVar63._28_4_ = (int)auVar61._28_4_;
          auVar116 = vpslld_avx2(auVar63,0x17);
          auVar82._8_4_ = 0x3f800000;
          auVar82._0_8_ = 0x3f8000003f800000;
          auVar82._12_4_ = 0x3f800000;
          auVar82._16_4_ = 0x3f800000;
          auVar82._20_4_ = 0x3f800000;
          auVar82._24_4_ = 0x3f800000;
          auVar82._28_4_ = 0x3f800000;
          auVar116 = vpaddd_avx2(auVar116,auVar82);
          auVar58 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar58),auVar83);
          auVar116 = vrcpps_avx(ZEXT1632(auVar58));
          auVar58 = vfmsub213ps_fma(ZEXT1632(auVar58),auVar116,auVar83);
          auVar58 = vfnmadd132ps_fma(ZEXT1632(auVar58),auVar116,auVar116);
          auVar61 = ZEXT1632(auVar58);
          break;
        case 5:
          auVar171._8_4_ = 0x42b0c0a5;
          auVar171._0_8_ = 0x42b0c0a542b0c0a5;
          auVar171._12_4_ = 0x42b0c0a5;
          auVar171._16_4_ = 0x42b0c0a5;
          auVar171._20_4_ = 0x42b0c0a5;
          auVar171._24_4_ = 0x42b0c0a5;
          auVar171._28_4_ = 0x42b0c0a5;
          auVar93 = vminps_avx(auVar171,auVar61);
          auVar179._8_4_ = 0xc2b0c0a5;
          auVar179._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar179._12_4_ = 0xc2b0c0a5;
          auVar179._16_4_ = 0xc2b0c0a5;
          auVar179._20_4_ = 0xc2b0c0a5;
          auVar179._24_4_ = 0xc2b0c0a5;
          auVar179._28_4_ = 0xc2b0c0a5;
          auVar133 = vmaxps_avx(auVar179,auVar93);
          auVar184._8_4_ = 0x3fb8aa3b;
          auVar184._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar184._12_4_ = 0x3fb8aa3b;
          auVar184._16_4_ = 0x3fb8aa3b;
          auVar184._20_4_ = 0x3fb8aa3b;
          auVar184._24_4_ = 0x3fb8aa3b;
          auVar184._28_4_ = 0x3fb8aa3b;
          auVar58 = vfmadd213ps_fma(auVar184,auVar133,auVar116);
          auVar178 = vroundps_avx(ZEXT1632(auVar58),1);
          auVar93 = vcmpps_avx(ZEXT1632(auVar58),auVar178,1);
          auVar93 = vandps_avx(auVar93,auVar83);
          auVar93 = vsubps_avx(auVar178,auVar93);
          auVar172._8_4_ = 0x3f317218;
          auVar172._0_8_ = 0x3f3172183f317218;
          auVar172._12_4_ = 0x3f317218;
          auVar172._16_4_ = 0x3f317218;
          auVar172._20_4_ = 0x3f317218;
          auVar172._24_4_ = 0x3f317218;
          auVar172._28_4_ = 0x3f317218;
          auVar59 = vfnmadd231ps_fma(auVar133,auVar93,auVar172);
          auVar75 = ZEXT1632(auVar59);
          fVar120 = auVar59._0_4_;
          fVar121 = auVar59._4_4_;
          fVar92 = auVar59._8_4_;
          fVar122 = auVar59._12_4_;
          auVar133._28_4_ = auVar178._28_4_;
          auVar133._0_28_ =
               ZEXT1628(CONCAT412(fVar122 * fVar122,
                                  CONCAT48(fVar92 * fVar92,
                                           CONCAT44(fVar121 * fVar121,fVar120 * fVar120))));
          auVar132._8_4_ = 0x39506967;
          auVar132._0_8_ = 0x3950696739506967;
          auVar132._12_4_ = 0x39506967;
          auVar132._16_4_ = 0x39506967;
          auVar132._20_4_ = 0x39506967;
          auVar132._24_4_ = 0x39506967;
          auVar132._28_4_ = 0x39506967;
          auVar193._8_4_ = 0x3ab743ce;
          auVar193._0_8_ = 0x3ab743ce3ab743ce;
          auVar193._12_4_ = 0x3ab743ce;
          auVar193._16_4_ = 0x3ab743ce;
          auVar193._20_4_ = 0x3ab743ce;
          auVar193._24_4_ = 0x3ab743ce;
          auVar193._28_4_ = 0x3ab743ce;
          auVar58 = vfmadd213ps_fma(auVar132,auVar75,auVar193);
          auVar175._8_4_ = 0x3c088908;
          auVar175._0_8_ = 0x3c0889083c088908;
          auVar175._12_4_ = 0x3c088908;
          auVar175._16_4_ = 0x3c088908;
          auVar175._20_4_ = 0x3c088908;
          auVar175._24_4_ = 0x3c088908;
          auVar175._28_4_ = 0x3c088908;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar75,auVar175);
          auVar125._8_4_ = 0x3d2aa9c1;
          auVar125._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar125._12_4_ = 0x3d2aa9c1;
          auVar125._16_4_ = 0x3d2aa9c1;
          auVar125._20_4_ = 0x3d2aa9c1;
          auVar125._24_4_ = 0x3d2aa9c1;
          auVar125._28_4_ = 0x3d2aa9c1;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar75,auVar125);
          auVar126._8_4_ = 0x3e2aaaaa;
          auVar126._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar126._12_4_ = 0x3e2aaaaa;
          auVar126._16_4_ = 0x3e2aaaaa;
          auVar126._20_4_ = 0x3e2aaaaa;
          auVar126._24_4_ = 0x3e2aaaaa;
          auVar126._28_4_ = 0x3e2aaaaa;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),ZEXT1632(auVar59),auVar126);
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),ZEXT1632(auVar59),auVar116);
          auVar144._0_4_ = fVar120 + 1.0;
          auVar144._4_4_ = fVar121 + 1.0;
          auVar144._8_4_ = fVar92 + 1.0;
          auVar144._12_4_ = fVar122 + 1.0;
          auVar144._16_4_ = 0x3f800000;
          auVar144._20_4_ = 0x3f800000;
          auVar144._24_4_ = 0x3f800000;
          auVar144._28_4_ = 0x3f800000;
          auVar58 = vfmadd231ps_fma(auVar144,auVar133,ZEXT1632(auVar58));
          auVar76._0_4_ = (int)auVar93._0_4_;
          auVar76._4_4_ = (int)auVar93._4_4_;
          auVar76._8_4_ = (int)auVar93._8_4_;
          auVar76._12_4_ = (int)auVar93._12_4_;
          auVar76._16_4_ = (int)auVar93._16_4_;
          auVar76._20_4_ = (int)auVar93._20_4_;
          auVar76._24_4_ = (int)auVar93._24_4_;
          auVar76._28_4_ = (int)auVar93._28_4_;
          auVar93 = vpslld_avx2(auVar76,0x17);
          auVar77._8_4_ = 0x3f800000;
          auVar77._0_8_ = 0x3f8000003f800000;
          auVar77._12_4_ = 0x3f800000;
          auVar77._16_4_ = 0x3f800000;
          auVar77._20_4_ = 0x3f800000;
          auVar77._24_4_ = 0x3f800000;
          auVar77._28_4_ = 0x3f800000;
          auVar93 = vpaddd_avx2(auVar93,auVar77);
          auVar58 = vfmadd213ps_fma(auVar93,ZEXT1632(auVar58),auVar83);
          auVar111._8_4_ = 0x800000;
          auVar111._0_8_ = 0x80000000800000;
          auVar111._12_4_ = 0x800000;
          auVar111._16_4_ = 0x800000;
          auVar111._20_4_ = 0x800000;
          auVar111._24_4_ = 0x800000;
          auVar111._28_4_ = 0x800000;
          auVar93 = vmaxps_avx(ZEXT1632(auVar58),auVar111);
          auVar133 = vpsrld_avx2(auVar93,0x17);
          auVar145._8_4_ = 0x807fffff;
          auVar145._0_8_ = 0x807fffff807fffff;
          auVar145._12_4_ = 0x807fffff;
          auVar145._16_4_ = 0x807fffff;
          auVar145._20_4_ = 0x807fffff;
          auVar145._24_4_ = 0x807fffff;
          auVar145._28_4_ = 0x807fffff;
          auVar93 = vandps_avx(auVar145,auVar93);
          auVar146._8_4_ = 0x3f000000;
          auVar146._0_8_ = 0x3f0000003f000000;
          auVar146._12_4_ = 0x3f000000;
          auVar146._16_4_ = 0x3f000000;
          auVar146._20_4_ = 0x3f000000;
          auVar146._24_4_ = 0x3f000000;
          auVar146._28_4_ = 0x3f000000;
          auVar178 = vorps_avx(auVar146,auVar93);
          auVar147._8_4_ = 0xffffff82;
          auVar147._0_8_ = 0xffffff82ffffff82;
          auVar147._12_4_ = 0xffffff82;
          auVar147._16_4_ = 0xffffff82;
          auVar147._20_4_ = 0xffffff82;
          auVar147._24_4_ = 0xffffff82;
          auVar147._28_4_ = 0xffffff82;
          auVar75 = vpaddd_avx2(auVar133,auVar147);
          auVar148._8_4_ = 0x3f3504f3;
          auVar148._0_8_ = 0x3f3504f33f3504f3;
          auVar148._12_4_ = 0x3f3504f3;
          auVar148._16_4_ = 0x3f3504f3;
          auVar148._20_4_ = 0x3f3504f3;
          auVar148._24_4_ = 0x3f3504f3;
          auVar148._28_4_ = 0x3f3504f3;
          auVar133 = vcmpps_avx(auVar178,auVar148,1);
          auVar93 = vandps_avx(auVar133,auVar178);
          auVar112._0_4_ = auVar93._0_4_ + auVar178._0_4_ + -1.0;
          auVar112._4_4_ = auVar93._4_4_ + auVar178._4_4_ + -1.0;
          auVar112._8_4_ = auVar93._8_4_ + auVar178._8_4_ + -1.0;
          auVar112._12_4_ = auVar93._12_4_ + auVar178._12_4_ + -1.0;
          auVar112._16_4_ = auVar93._16_4_ + auVar178._16_4_ + -1.0;
          auVar112._20_4_ = auVar93._20_4_ + auVar178._20_4_ + -1.0;
          auVar112._24_4_ = auVar93._24_4_ + auVar178._24_4_ + -1.0;
          auVar112._28_4_ = auVar93._28_4_ + auVar178._28_4_ + -1.0;
          auVar178 = vcmpps_avx(ZEXT1632(auVar58),ZEXT832(0) << 0x20,2);
          auVar75 = vcvtdq2ps_avx(auVar75);
          auVar93 = vandps_avx(auVar133,auVar83);
          auVar93 = vsubps_avx(auVar75,auVar93);
          auVar149._8_4_ = 0x3d9021bb;
          auVar149._0_8_ = 0x3d9021bb3d9021bb;
          auVar149._12_4_ = 0x3d9021bb;
          auVar149._16_4_ = 0x3d9021bb;
          auVar149._20_4_ = 0x3d9021bb;
          auVar149._24_4_ = 0x3d9021bb;
          auVar149._28_4_ = 0x3d9021bb;
          auVar162._8_4_ = 0xbdebd1b8;
          auVar162._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar162._12_4_ = 0xbdebd1b8;
          auVar162._16_4_ = 0xbdebd1b8;
          auVar162._20_4_ = 0xbdebd1b8;
          auVar162._24_4_ = 0xbdebd1b8;
          auVar162._28_4_ = 0xbdebd1b8;
          auVar58 = vfmadd213ps_fma(auVar149,auVar112,auVar162);
          auVar163._8_4_ = 0x3def251a;
          auVar163._0_8_ = 0x3def251a3def251a;
          auVar163._12_4_ = 0x3def251a;
          auVar163._16_4_ = 0x3def251a;
          auVar163._20_4_ = 0x3def251a;
          auVar163._24_4_ = 0x3def251a;
          auVar163._28_4_ = 0x3def251a;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar112,auVar163);
          auVar164._8_4_ = 0xbdfe5d4f;
          auVar164._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar164._12_4_ = 0xbdfe5d4f;
          auVar164._16_4_ = 0xbdfe5d4f;
          auVar164._20_4_ = 0xbdfe5d4f;
          auVar164._24_4_ = 0xbdfe5d4f;
          auVar164._28_4_ = 0xbdfe5d4f;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar112,auVar164);
          auVar165._8_4_ = 0x3e11e9bf;
          auVar165._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar165._12_4_ = 0x3e11e9bf;
          auVar165._16_4_ = 0x3e11e9bf;
          auVar165._20_4_ = 0x3e11e9bf;
          auVar165._24_4_ = 0x3e11e9bf;
          auVar165._28_4_ = 0x3e11e9bf;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar112,auVar165);
          auVar166._8_4_ = 0xbe2aae50;
          auVar166._0_8_ = 0xbe2aae50be2aae50;
          auVar166._12_4_ = 0xbe2aae50;
          auVar166._16_4_ = 0xbe2aae50;
          auVar166._20_4_ = 0xbe2aae50;
          auVar166._24_4_ = 0xbe2aae50;
          auVar166._28_4_ = 0xbe2aae50;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar112,auVar166);
          auVar167._8_4_ = 0x3e4cceac;
          auVar167._0_8_ = 0x3e4cceac3e4cceac;
          auVar167._12_4_ = 0x3e4cceac;
          auVar167._16_4_ = 0x3e4cceac;
          auVar167._20_4_ = 0x3e4cceac;
          auVar167._24_4_ = 0x3e4cceac;
          auVar167._28_4_ = 0x3e4cceac;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar112,auVar167);
          auVar168._8_4_ = 0xbe7ffffc;
          auVar168._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar168._12_4_ = 0xbe7ffffc;
          auVar168._16_4_ = 0xbe7ffffc;
          auVar168._20_4_ = 0xbe7ffffc;
          auVar168._24_4_ = 0xbe7ffffc;
          auVar168._28_4_ = 0xbe7ffffc;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar112,auVar168);
          auVar169._8_4_ = 0x3eaaaaaa;
          auVar169._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar169._12_4_ = 0x3eaaaaaa;
          auVar169._16_4_ = 0x3eaaaaaa;
          auVar169._20_4_ = 0x3eaaaaaa;
          auVar169._24_4_ = 0x3eaaaaaa;
          auVar169._28_4_ = 0x3eaaaaaa;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar112,auVar169);
          auVar59 = vfmsub213ps_fma(ZEXT1632(auVar58),auVar112,auVar116);
          auVar58 = vfmadd213ps_fma(auVar93,auVar172,auVar112);
          auVar75._4_4_ = auVar112._4_4_ * auVar112._4_4_;
          auVar75._0_4_ = auVar112._0_4_ * auVar112._0_4_;
          auVar75._8_4_ = auVar112._8_4_ * auVar112._8_4_;
          auVar75._12_4_ = auVar112._12_4_ * auVar112._12_4_;
          auVar75._16_4_ = auVar112._16_4_ * auVar112._16_4_;
          auVar75._20_4_ = auVar112._20_4_ * auVar112._20_4_;
          auVar75._24_4_ = auVar112._24_4_ * auVar112._24_4_;
          auVar75._28_4_ = auVar112._28_4_;
          auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar75,ZEXT1632(auVar59));
          auVar180._8_4_ = 0xc0000000;
          auVar180._0_8_ = 0xc0000000c0000000;
          auVar180._12_4_ = 0xc0000000;
          auVar180._16_4_ = 0xc0000000;
          auVar180._20_4_ = 0xc0000000;
          auVar180._24_4_ = 0xc0000000;
          auVar180._28_4_ = 0xc0000000;
          auVar192._4_4_ = auVar58._4_4_ * -2.0;
          auVar192._0_4_ = auVar58._0_4_ * -2.0;
          auVar192._8_4_ = auVar58._8_4_ * -2.0;
          auVar192._12_4_ = auVar58._12_4_ * -2.0;
          auVar192._16_4_ = 0x80000000;
          auVar192._20_4_ = 0x80000000;
          auVar192._24_4_ = 0x80000000;
          auVar192._28_4_ = auVar112._28_4_;
          auVar134._8_4_ = 0x7fffffff;
          auVar134._0_8_ = 0x7fffffff7fffffff;
          auVar134._12_4_ = 0x7fffffff;
          auVar134._16_4_ = 0x7fffffff;
          auVar134._20_4_ = 0x7fffffff;
          auVar134._24_4_ = 0x7fffffff;
          auVar134._28_4_ = 0x7fffffff;
          auVar93 = vblendvps_avx(auVar192,auVar134,auVar178);
          auVar113._8_4_ = 0x42b0c0a5;
          auVar113._0_8_ = 0x42b0c0a542b0c0a5;
          auVar113._12_4_ = 0x42b0c0a5;
          auVar113._16_4_ = 0x42b0c0a5;
          auVar113._20_4_ = 0x42b0c0a5;
          auVar113._24_4_ = 0x42b0c0a5;
          auVar113._28_4_ = 0x42b0c0a5;
          auVar93 = vminps_avx(auVar93,auVar113);
          auVar114._8_4_ = 0xc2b0c0a5;
          auVar114._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar114._12_4_ = 0xc2b0c0a5;
          auVar114._16_4_ = 0xc2b0c0a5;
          auVar114._20_4_ = 0xc2b0c0a5;
          auVar114._24_4_ = 0xc2b0c0a5;
          auVar114._28_4_ = 0xc2b0c0a5;
          auVar133 = vmaxps_avx(auVar93,auVar114);
          auVar58 = vfmadd213ps_fma(auVar184,auVar133,auVar116);
          auVar178 = vroundps_avx(ZEXT1632(auVar58),1);
          auVar93 = vcmpps_avx(ZEXT1632(auVar58),auVar178,1);
          auVar93 = vandps_avx(auVar93,auVar83);
          auVar93 = vsubps_avx(auVar178,auVar93);
          auVar59 = vfnmadd231ps_fma(auVar133,auVar93,auVar172);
          auVar133 = ZEXT1632(auVar59);
          fVar120 = auVar59._0_4_;
          fVar121 = auVar59._4_4_;
          fVar92 = auVar59._8_4_;
          fVar122 = auVar59._12_4_;
          auVar178._28_4_ = auVar178._28_4_;
          auVar178._0_28_ =
               ZEXT1628(CONCAT412(fVar122 * fVar122,
                                  CONCAT48(fVar92 * fVar92,
                                           CONCAT44(fVar121 * fVar121,fVar120 * fVar120))));
          auVar150._8_4_ = 0x39506967;
          auVar150._0_8_ = 0x3950696739506967;
          auVar150._12_4_ = 0x39506967;
          auVar150._16_4_ = 0x39506967;
          auVar150._20_4_ = 0x39506967;
          auVar150._24_4_ = 0x39506967;
          auVar150._28_4_ = 0x39506967;
          auVar56 = ZEXT864(0) << 0x20;
          auVar58 = vfmadd213ps_fma(auVar150,auVar133,auVar193);
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar133,auVar175);
          auVar173._8_4_ = 0x3d2aa9c1;
          auVar173._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar173._12_4_ = 0x3d2aa9c1;
          auVar173._16_4_ = 0x3d2aa9c1;
          auVar173._20_4_ = 0x3d2aa9c1;
          auVar173._24_4_ = 0x3d2aa9c1;
          auVar173._28_4_ = 0x3d2aa9c1;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar133,auVar173);
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),ZEXT1632(auVar59),auVar126);
          auVar177 = ZEXT3264(auVar116);
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),ZEXT1632(auVar59),auVar116);
          auVar94._0_4_ = fVar120 + 1.0;
          auVar94._4_4_ = fVar121 + 1.0;
          auVar94._8_4_ = fVar92 + 1.0;
          auVar94._12_4_ = fVar122 + 1.0;
          auVar94._16_4_ = 0x3f800000;
          auVar94._20_4_ = 0x3f800000;
          auVar94._24_4_ = 0x3f800000;
          auVar94._28_4_ = 0x3f800000;
          auVar58 = vfmadd231ps_fma(auVar94,auVar178,ZEXT1632(auVar58));
          auVar115._0_4_ = (int)auVar93._0_4_;
          auVar115._4_4_ = (int)auVar93._4_4_;
          auVar115._8_4_ = (int)auVar93._8_4_;
          auVar115._12_4_ = (int)auVar93._12_4_;
          auVar115._16_4_ = (int)auVar93._16_4_;
          auVar115._20_4_ = (int)auVar93._20_4_;
          auVar115._24_4_ = (int)auVar93._24_4_;
          auVar115._28_4_ = (int)auVar93._28_4_;
          auVar116 = vpslld_avx2(auVar115,0x17);
          auVar116 = vpaddd_avx2(auVar116,auVar77);
          auVar58 = vfmadd213ps_fma(auVar116,ZEXT1632(auVar58),auVar83);
          auVar116 = vrcpps_avx(ZEXT1632(auVar58));
          auVar58 = vfmsub213ps_fma(ZEXT1632(auVar58),auVar116,auVar83);
          auVar58 = vfnmadd132ps_fma(ZEXT1632(auVar58),auVar116,auVar116);
          auVar58 = vfnmadd213ps_fma(ZEXT1632(auVar58),auVar180,auVar102);
          auVar74 = ZEXT1628(auVar58);
          goto LAB_001e63a2;
        case 6:
          uVar3 = **(undefined4 **)(p_Var8 + 0x40 + (long)&(this->weight_data_int8).data);
          auVar116._4_4_ = uVar3;
          auVar116._0_4_ = uVar3;
          auVar116._8_4_ = uVar3;
          auVar116._12_4_ = uVar3;
          auVar116._16_4_ = uVar3;
          auVar116._20_4_ = uVar3;
          auVar116._24_4_ = uVar3;
          auVar116._28_4_ = uVar3;
          uVar3 = (*(undefined4 **)(p_Var8 + 0x40 + (long)&(this->weight_data_int8).data))[1];
          auVar93._4_4_ = uVar3;
          auVar93._0_4_ = uVar3;
          auVar93._8_4_ = uVar3;
          auVar93._12_4_ = uVar3;
          auVar93._16_4_ = uVar3;
          auVar93._20_4_ = uVar3;
          auVar93._24_4_ = uVar3;
          auVar93._28_4_ = uVar3;
          auVar58 = vfmadd231ps_fma(auVar93,auVar61,auVar116);
          auVar116 = vmaxps_avx(ZEXT1632(auVar58),auVar76);
          auVar116 = vminps_avx(auVar116,auVar83);
          auVar74 = auVar116._0_28_;
LAB_001e63a2:
          auVar61._4_4_ = auVar74._4_4_ * fVar72;
          auVar61._0_4_ = auVar74._0_4_ * fVar57;
          auVar61._8_4_ = auVar74._8_4_ * auVar61._8_4_;
          auVar61._12_4_ = auVar74._12_4_ * auVar61._12_4_;
          auVar61._16_4_ = auVar74._16_4_ * auVar61._16_4_;
          auVar61._20_4_ = auVar74._20_4_ * auVar61._20_4_;
          auVar61._24_4_ = auVar74._24_4_ * auVar61._24_4_;
        }
        *(undefined1 (*) [32])((long)pvVar5 + local_e0 * 4) = auVar61;
        uVar37 = uVar37 + 1;
        pvVar49 = (void *)((long)pvVar49 + local_100);
        pvVar38 = (void *)((long)pvVar38 + local_100);
        pvVar44 = (void *)((long)pvVar44 + local_100);
        pvVar46 = (void *)((long)local_c0 + local_100);
        pvVar52 = (void *)((long)local_c8 + local_100);
        pvVar33 = (void *)((long)local_d0 + local_100);
        pvVar40 = (void *)((long)local_d8 + local_100);
        pvVar42 = (void *)((long)pvVar42 + local_100);
      } while (uVar37 != local_f8);
    }
    iVar23 = (int)uVar27;
    uVar25 = *(int *)(pp_Var6[-3] + 0x28 + (long)&(this->weight_data_int8).data) - iVar23;
    uVar35 = (int)uVar25 >> 2;
    iVar23 = (uVar25 & 0xfffffffc) + iVar23;
    if (0 < (int)uVar35) {
      uVar37 = 0;
      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar177 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar110._8_4_ = 0x3f800000;
      auVar110._0_8_ = 0x3f8000003f800000;
      auVar110._12_4_ = 0x3f800000;
      auVar110._16_4_ = 0x3f800000;
      auVar110._20_4_ = 0x3f800000;
      auVar110._24_4_ = 0x3f800000;
      auVar110._28_4_ = 0x3f800000;
      do {
        uVar2 = uVar27 + uVar37 * 4;
        if (*(int *)(pp_Var6[-3] + 0x2c + (long)&(this->weight_data_int8).data) == 0) {
          fVar57 = 0.0;
          fVar72 = 0.0;
          fVar120 = 0.0;
          fVar121 = 0.0;
        }
        else {
          pfVar1 = (float *)(*(long *)(&this->field_0x178 + (long)pp_Var6[-3]) + uVar2 * 4);
          fVar57 = *pfVar1;
          fVar72 = pfVar1[1];
          fVar120 = pfVar1[2];
          fVar121 = pfVar1[3];
        }
        pauVar26 = (undefined1 (*) [16])((long)pvVar7 + uVar2 * lVar28 * 2);
        pauVar54 = (undefined1 (*) [16])((long)pvVar7 + (uVar2 | 1) * lVar28 * 2);
        pauVar50 = (undefined1 (*) [16])((long)pvVar7 + (uVar2 | 2) * lVar28 * 2);
        pauVar34 = (undefined1 (*) [16])((long)pvVar7 + (uVar2 | 3) * lVar28 * 2);
        pauVar29 = local_198;
        if ((int)uVar41 < 1) {
          auVar116 = SUB6432(ZEXT864(0),0);
          auVar83 = SUB6432(ZEXT864(0),0);
          auVar58 = ZEXT816(0);
          auVar102 = SUB6432(ZEXT864(0),0);
        }
        else {
          auVar91 = ZEXT864(0);
          auVar71 = ZEXT864(0);
          auVar105 = ZEXT864(0);
          auVar143 = ZEXT864(0);
          iVar47 = uVar41 + 1;
          do {
            auVar102 = *pauVar29;
            auVar58 = vlddqu_avx(*pauVar26);
            auVar83 = vcvtph2ps_f16c(auVar58);
            auVar58 = vfmadd231ps_fma(auVar143._0_32_,auVar102,auVar83);
            auVar143 = ZEXT1664(auVar58);
            auVar116 = ZEXT1632(auVar58);
            auVar58 = vlddqu_avx(*pauVar54);
            auVar83 = vcvtph2ps_f16c(auVar58);
            auVar58 = vfmadd231ps_fma(auVar105._0_32_,auVar102,auVar83);
            auVar105 = ZEXT1664(auVar58);
            auVar83 = ZEXT1632(auVar58);
            auVar58 = vlddqu_avx(*pauVar50);
            auVar61 = vcvtph2ps_f16c(auVar58);
            auVar58 = vfmadd231ps_fma(auVar71._0_32_,auVar102,auVar61);
            auVar71 = ZEXT1664(auVar58);
            auVar59 = vlddqu_avx(*pauVar34);
            auVar61 = vcvtph2ps_f16c(auVar59);
            auVar59 = vfmadd231ps_fma(auVar91._0_32_,auVar102,auVar61);
            auVar91 = ZEXT1664(auVar59);
            auVar102 = ZEXT1632(auVar59);
            pauVar29 = pauVar29 + 1;
            pauVar26 = pauVar26 + 1;
            pauVar54 = pauVar54 + 1;
            pauVar50 = pauVar50 + 1;
            pauVar34 = pauVar34 + 1;
            iVar47 = iVar47 + -1;
          } while (1 < iVar47);
        }
        auVar93 = ZEXT1632(auVar58);
        auVar61 = auVar56._0_32_;
        if ((uVar24 & 7) != 0) {
          uVar53 = 0;
          local_138 = auVar61;
          _local_b8 = auVar61;
          local_98 = auVar61;
          do {
            *(undefined4 *)(local_138 + uVar53 * 2) = *(undefined4 *)(*pauVar29 + uVar53 * 2);
            *(undefined2 *)(local_b8 + uVar53) = *(undefined2 *)(*pauVar26 + uVar53);
            *(undefined2 *)(local_b8 + uVar53 + 0x10) = *(undefined2 *)(*pauVar54 + uVar53);
            *(undefined2 *)(local_98 + uVar53) = *(undefined2 *)(*pauVar50 + uVar53);
            *(undefined2 *)(local_98 + uVar53 + 0x10) = *(undefined2 *)(*pauVar34 + uVar53);
            uVar53 = uVar53 + 2;
          } while ((uVar24 & 7) * 2 != uVar53);
          auVar58 = vlddqu_avx(local_b8);
          auVar133 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar116,local_138,auVar133);
          auVar116 = ZEXT1632(auVar58);
          auVar58 = vlddqu_avx(auStack_a8);
          auVar133 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar83,local_138,auVar133);
          auVar83 = ZEXT1632(auVar58);
          auVar58 = vlddqu_avx(local_98._0_16_);
          auVar133 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar93,local_138,auVar133);
          auVar93 = ZEXT1632(auVar58);
          auVar58 = vlddqu_avx(local_98._16_16_);
          auVar133 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar102,local_138,auVar133);
          auVar102 = ZEXT1632(auVar58);
        }
        auVar102 = vhaddps_avx(auVar93,auVar102);
        auVar83 = vhaddps_avx(auVar116,auVar83);
        auVar102 = vhaddps_avx(auVar83,auVar102);
        fVar57 = fVar57 + auVar102._0_4_ + auVar102._16_4_;
        fVar72 = fVar72 + auVar102._4_4_ + auVar102._20_4_;
        auVar58._0_8_ = CONCAT44(fVar72,fVar57);
        auVar58._8_4_ = fVar120 + auVar102._8_4_ + auVar102._24_4_;
        auVar58._12_4_ = fVar121 + auVar102._12_4_ + auVar102._28_4_;
        auVar181._16_16_ = auVar56._0_16_;
        auVar181._0_16_ = auVar58;
        p_Var8 = pp_Var6[-3];
        auVar102 = auVar177._0_32_;
        switch(*(undefined4 *)(p_Var8 + 0x38 + (long)&(this->weight_data_int8).data)) {
        case 1:
          auVar102 = vmaxps_avx(auVar181,auVar61);
          auVar58 = auVar102._0_16_;
          break;
        case 2:
          auVar102 = vmaxps_avx(auVar181,auVar61);
          auVar83 = vminps_avx(auVar181,auVar61);
          uVar3 = **(undefined4 **)(p_Var8 + 0x40 + (long)&(this->weight_data_int8).data);
          auVar182._4_4_ = uVar3;
          auVar182._0_4_ = uVar3;
          auVar182._8_4_ = uVar3;
          auVar182._12_4_ = uVar3;
          auVar182._16_4_ = uVar3;
          auVar182._20_4_ = uVar3;
          auVar182._24_4_ = uVar3;
          auVar182._28_4_ = uVar3;
          auVar58 = vfmadd213ps_fma(auVar182,auVar83,auVar102);
          break;
        case 3:
          uVar3 = **(undefined4 **)(p_Var8 + 0x40 + (long)&(this->weight_data_int8).data);
          auVar67._4_4_ = uVar3;
          auVar67._0_4_ = uVar3;
          auVar67._8_4_ = uVar3;
          auVar67._12_4_ = uVar3;
          auVar67._16_4_ = uVar3;
          auVar67._20_4_ = uVar3;
          auVar67._24_4_ = uVar3;
          auVar67._28_4_ = uVar3;
          uVar3 = (*(undefined4 **)(p_Var8 + 0x40 + (long)&(this->weight_data_int8).data))[1];
          auVar85._4_4_ = uVar3;
          auVar85._0_4_ = uVar3;
          auVar85._8_4_ = uVar3;
          auVar85._12_4_ = uVar3;
          auVar85._16_4_ = uVar3;
          auVar85._20_4_ = uVar3;
          auVar85._24_4_ = uVar3;
          auVar85._28_4_ = uVar3;
          auVar102 = vmaxps_avx(auVar181,auVar67);
          auVar102 = vminps_avx(auVar102,auVar85);
          auVar58 = auVar102._0_16_;
          break;
        case 4:
          auVar68._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
          auVar68._8_4_ = -auVar58._8_4_;
          auVar68._12_4_ = -auVar58._12_4_;
          auVar68._16_4_ = 0x80000000;
          auVar68._20_4_ = 0x80000000;
          auVar68._24_4_ = auVar56._8_4_ ^ 0x80000000;
          auVar68._28_4_ = auVar56._12_4_ ^ 0x80000000;
          auVar86._8_4_ = 0x42b0c0a5;
          auVar86._0_8_ = 0x42b0c0a542b0c0a5;
          auVar86._12_4_ = 0x42b0c0a5;
          auVar86._16_4_ = 0x42b0c0a5;
          auVar86._20_4_ = 0x42b0c0a5;
          auVar86._24_4_ = 0x42b0c0a5;
          auVar86._28_4_ = 0x42b0c0a5;
          auVar83 = vminps_avx(auVar68,auVar86);
          auVar87._8_4_ = 0xc2b0c0a5;
          auVar87._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar87._12_4_ = 0xc2b0c0a5;
          auVar87._16_4_ = 0xc2b0c0a5;
          auVar87._20_4_ = 0xc2b0c0a5;
          auVar87._24_4_ = 0xc2b0c0a5;
          auVar87._28_4_ = 0xc2b0c0a5;
          auVar116 = vmaxps_avx(auVar83,auVar87);
          auVar88._8_4_ = 0x3fb8aa3b;
          auVar88._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar88._12_4_ = 0x3fb8aa3b;
          auVar88._16_4_ = 0x3fb8aa3b;
          auVar88._20_4_ = 0x3fb8aa3b;
          auVar88._24_4_ = 0x3fb8aa3b;
          auVar88._28_4_ = 0x3fb8aa3b;
          auVar58 = vfmadd213ps_fma(auVar88,auVar116,auVar102);
          auVar61 = vroundps_avx(ZEXT1632(auVar58),1);
          auVar83 = vcmpps_avx(ZEXT1632(auVar58),auVar61,1);
          auVar83 = vandps_avx(auVar83,auVar110);
          auVar83 = vsubps_avx(auVar61,auVar83);
          auVar103._8_4_ = 0xbf317218;
          auVar103._0_8_ = 0xbf317218bf317218;
          auVar103._12_4_ = 0xbf317218;
          auVar103._16_4_ = 0xbf317218;
          auVar103._20_4_ = 0xbf317218;
          auVar103._24_4_ = 0xbf317218;
          auVar103._28_4_ = 0xbf317218;
          auVar59 = vfmadd231ps_fma(auVar116,auVar83,auVar103);
          auVar116 = ZEXT1632(auVar59);
          fVar57 = auVar59._0_4_;
          fVar72 = auVar59._4_4_;
          fVar120 = auVar59._8_4_;
          fVar121 = auVar59._12_4_;
          auVar14._28_4_ = 0xbf317218;
          auVar14._0_28_ =
               ZEXT1628(CONCAT412(fVar121 * fVar121,
                                  CONCAT48(fVar120 * fVar120,
                                           CONCAT44(fVar72 * fVar72,fVar57 * fVar57))));
          auVar119._8_4_ = 0x39506967;
          auVar119._0_8_ = 0x3950696739506967;
          auVar119._12_4_ = 0x39506967;
          auVar119._16_4_ = 0x39506967;
          auVar119._20_4_ = 0x39506967;
          auVar119._24_4_ = 0x39506967;
          auVar119._28_4_ = 0x39506967;
          auVar142._8_4_ = 0x3ab743ce;
          auVar142._0_8_ = 0x3ab743ce3ab743ce;
          auVar142._12_4_ = 0x3ab743ce;
          auVar142._16_4_ = 0x3ab743ce;
          auVar142._20_4_ = 0x3ab743ce;
          auVar142._24_4_ = 0x3ab743ce;
          auVar142._28_4_ = 0x3ab743ce;
          auVar58 = vfmadd213ps_fma(auVar119,auVar116,auVar142);
          auVar131._8_4_ = 0x3c088908;
          auVar131._0_8_ = 0x3c0889083c088908;
          auVar131._12_4_ = 0x3c088908;
          auVar131._16_4_ = 0x3c088908;
          auVar131._20_4_ = 0x3c088908;
          auVar131._24_4_ = 0x3c088908;
          auVar131._28_4_ = 0x3c088908;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar116,auVar131);
          auVar108._8_4_ = 0x3d2aa9c1;
          auVar108._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar108._12_4_ = 0x3d2aa9c1;
          auVar108._16_4_ = 0x3d2aa9c1;
          auVar108._20_4_ = 0x3d2aa9c1;
          auVar108._24_4_ = 0x3d2aa9c1;
          auVar108._28_4_ = 0x3d2aa9c1;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar116,auVar108);
          auVar109._8_4_ = 0x3e2aaaaa;
          auVar109._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar109._12_4_ = 0x3e2aaaaa;
          auVar109._16_4_ = 0x3e2aaaaa;
          auVar109._20_4_ = 0x3e2aaaaa;
          auVar109._24_4_ = 0x3e2aaaaa;
          auVar109._28_4_ = 0x3e2aaaaa;
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),ZEXT1632(auVar59),auVar109);
          auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),ZEXT1632(auVar59),auVar102);
          auVar69._0_4_ = fVar57 + 1.0;
          auVar69._4_4_ = fVar72 + 1.0;
          auVar69._8_4_ = fVar120 + 1.0;
          auVar69._12_4_ = fVar121 + 1.0;
          auVar69._16_4_ = 0x3f800000;
          auVar69._20_4_ = 0x3f800000;
          auVar69._24_4_ = 0x3f800000;
          auVar69._28_4_ = 0x3f800000;
          auVar58 = vfmadd231ps_fma(auVar69,auVar14,ZEXT1632(auVar58));
          auVar89._0_4_ = (int)auVar83._0_4_;
          auVar89._4_4_ = (int)auVar83._4_4_;
          auVar89._8_4_ = (int)auVar83._8_4_;
          auVar89._12_4_ = (int)auVar83._12_4_;
          auVar89._16_4_ = (int)auVar83._16_4_;
          auVar89._20_4_ = (int)auVar83._20_4_;
          auVar89._24_4_ = (int)auVar83._24_4_;
          auVar89._28_4_ = (int)auVar83._28_4_;
          auVar102 = vpslld_avx2(auVar89,0x17);
          auVar104._8_4_ = 0x3f800000;
          auVar104._0_8_ = 0x3f8000003f800000;
          auVar104._12_4_ = 0x3f800000;
          auVar104._16_4_ = 0x3f800000;
          auVar104._20_4_ = 0x3f800000;
          auVar104._24_4_ = 0x3f800000;
          auVar104._28_4_ = 0x3f800000;
          auVar102 = vpaddd_avx2(auVar102,auVar104);
          auVar58 = vfmadd213ps_fma(auVar102,ZEXT1632(auVar58),auVar110);
          auVar102 = vrcpps_avx(ZEXT1632(auVar58));
          auVar58 = vfmsub213ps_fma(ZEXT1632(auVar58),auVar102,auVar110);
          auVar58 = vfnmadd132ps_fma(ZEXT1632(auVar58),auVar102,auVar102);
          break;
        case 5:
          auVar138._8_4_ = 0x42b0c0a5;
          auVar138._0_8_ = 0x42b0c0a542b0c0a5;
          auVar138._12_4_ = 0x42b0c0a5;
          auVar138._16_4_ = 0x42b0c0a5;
          auVar138._20_4_ = 0x42b0c0a5;
          auVar138._24_4_ = 0x42b0c0a5;
          auVar138._28_4_ = 0x42b0c0a5;
          auVar83 = vminps_avx(auVar181,auVar138);
          auVar151._8_4_ = 0xc2b0c0a5;
          auVar151._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar151._12_4_ = 0xc2b0c0a5;
          auVar151._16_4_ = 0xc2b0c0a5;
          auVar151._20_4_ = 0xc2b0c0a5;
          auVar151._24_4_ = 0xc2b0c0a5;
          auVar151._28_4_ = 0xc2b0c0a5;
          auVar116 = vmaxps_avx(auVar151,auVar83);
          auVar170._8_4_ = 0x3fb8aa3b;
          auVar170._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar170._12_4_ = 0x3fb8aa3b;
          auVar170._16_4_ = 0x3fb8aa3b;
          auVar170._20_4_ = 0x3fb8aa3b;
          auVar170._24_4_ = 0x3fb8aa3b;
          auVar170._28_4_ = 0x3fb8aa3b;
          auVar59 = vfmadd213ps_fma(auVar170,auVar116,auVar102);
          auVar61 = vroundps_avx(ZEXT1632(auVar59),1);
          auVar83 = vcmpps_avx(ZEXT1632(auVar59),auVar61,1);
          auVar83 = vandps_avx(auVar83,auVar110);
          auVar83 = vsubps_avx(auVar61,auVar83);
          auVar139._8_4_ = 0x3f317218;
          auVar139._0_8_ = 0x3f3172183f317218;
          auVar139._12_4_ = 0x3f317218;
          auVar139._16_4_ = 0x3f317218;
          auVar139._20_4_ = 0x3f317218;
          auVar139._24_4_ = 0x3f317218;
          auVar139._28_4_ = 0x3f317218;
          auVar60 = vfnmadd231ps_fma(auVar116,auVar83,auVar139);
          auVar116 = ZEXT1632(auVar60);
          fVar120 = auVar60._0_4_;
          fVar121 = auVar60._4_4_;
          fVar92 = auVar60._8_4_;
          fVar122 = auVar60._12_4_;
          auVar10._28_4_ = auVar61._28_4_;
          auVar10._0_28_ =
               ZEXT1628(CONCAT412(fVar122 * fVar122,
                                  CONCAT48(fVar92 * fVar92,
                                           CONCAT44(fVar121 * fVar121,fVar120 * fVar120))));
          auVar176._8_4_ = 0x39506967;
          auVar176._0_8_ = 0x3950696739506967;
          auVar176._12_4_ = 0x39506967;
          auVar176._16_4_ = 0x39506967;
          auVar176._20_4_ = 0x39506967;
          auVar176._24_4_ = 0x39506967;
          auVar176._28_4_ = 0x39506967;
          auVar174._8_4_ = 0x3ab743ce;
          auVar174._0_8_ = 0x3ab743ce3ab743ce;
          auVar174._12_4_ = 0x3ab743ce;
          auVar174._16_4_ = 0x3ab743ce;
          auVar174._20_4_ = 0x3ab743ce;
          auVar174._24_4_ = 0x3ab743ce;
          auVar174._28_4_ = 0x3ab743ce;
          auVar59 = vfmadd213ps_fma(auVar176,auVar116,auVar174);
          auVar129._8_4_ = 0x3c088908;
          auVar129._0_8_ = 0x3c0889083c088908;
          auVar129._12_4_ = 0x3c088908;
          auVar129._16_4_ = 0x3c088908;
          auVar129._20_4_ = 0x3c088908;
          auVar129._24_4_ = 0x3c088908;
          auVar129._28_4_ = 0x3c088908;
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar116,auVar129);
          auVar106._8_4_ = 0x3d2aa9c1;
          auVar106._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar106._12_4_ = 0x3d2aa9c1;
          auVar106._16_4_ = 0x3d2aa9c1;
          auVar106._20_4_ = 0x3d2aa9c1;
          auVar106._24_4_ = 0x3d2aa9c1;
          auVar106._28_4_ = 0x3d2aa9c1;
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar116,auVar106);
          auVar130._8_4_ = 0x3e2aaaaa;
          auVar130._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar130._12_4_ = 0x3e2aaaaa;
          auVar130._16_4_ = 0x3e2aaaaa;
          auVar130._20_4_ = 0x3e2aaaaa;
          auVar130._24_4_ = 0x3e2aaaaa;
          auVar130._28_4_ = 0x3e2aaaaa;
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),ZEXT1632(auVar60),auVar130);
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),ZEXT1632(auVar60),auVar102);
          auVar185._0_4_ = fVar120 + 1.0;
          auVar185._4_4_ = fVar121 + 1.0;
          auVar185._8_4_ = fVar92 + 1.0;
          auVar185._12_4_ = fVar122 + 1.0;
          auVar185._16_4_ = 0x3f800000;
          auVar185._20_4_ = 0x3f800000;
          auVar185._24_4_ = 0x3f800000;
          auVar185._28_4_ = 0x3f800000;
          auVar59 = vfmadd231ps_fma(auVar185,auVar10,ZEXT1632(auVar59));
          auVar65._0_4_ = (int)auVar83._0_4_;
          auVar65._4_4_ = (int)auVar83._4_4_;
          auVar65._8_4_ = (int)auVar83._8_4_;
          auVar65._12_4_ = (int)auVar83._12_4_;
          auVar65._16_4_ = (int)auVar83._16_4_;
          auVar65._20_4_ = (int)auVar83._20_4_;
          auVar65._24_4_ = (int)auVar83._24_4_;
          auVar65._28_4_ = (int)auVar83._28_4_;
          auVar83 = vpslld_avx2(auVar65,0x17);
          auVar66._8_4_ = 0x3f800000;
          auVar66._0_8_ = 0x3f8000003f800000;
          auVar66._12_4_ = 0x3f800000;
          auVar66._16_4_ = 0x3f800000;
          auVar66._20_4_ = 0x3f800000;
          auVar66._24_4_ = 0x3f800000;
          auVar66._28_4_ = 0x3f800000;
          auVar83 = vpaddd_avx2(auVar83,auVar66);
          auVar59 = vfmadd213ps_fma(auVar83,ZEXT1632(auVar59),auVar110);
          auVar97._8_4_ = 0x800000;
          auVar97._0_8_ = 0x80000000800000;
          auVar97._12_4_ = 0x800000;
          auVar97._16_4_ = 0x800000;
          auVar97._20_4_ = 0x800000;
          auVar97._24_4_ = 0x800000;
          auVar97._28_4_ = 0x800000;
          auVar83 = vmaxps_avx(ZEXT1632(auVar59),auVar97);
          auVar116 = vpsrld_avx2(auVar83,0x17);
          auVar186._8_4_ = 0x807fffff;
          auVar186._0_8_ = 0x807fffff807fffff;
          auVar186._12_4_ = 0x807fffff;
          auVar186._16_4_ = 0x807fffff;
          auVar186._20_4_ = 0x807fffff;
          auVar186._24_4_ = 0x807fffff;
          auVar186._28_4_ = 0x807fffff;
          auVar83 = vandps_avx(auVar186,auVar83);
          auVar187._8_4_ = 0x3f000000;
          auVar187._0_8_ = 0x3f0000003f000000;
          auVar187._12_4_ = 0x3f000000;
          auVar187._16_4_ = 0x3f000000;
          auVar187._20_4_ = 0x3f000000;
          auVar187._24_4_ = 0x3f000000;
          auVar187._28_4_ = 0x3f000000;
          auVar61 = vorps_avx(auVar187,auVar83);
          auVar188._8_4_ = 0xffffff82;
          auVar188._0_8_ = 0xffffff82ffffff82;
          auVar188._12_4_ = 0xffffff82;
          auVar188._16_4_ = 0xffffff82;
          auVar188._20_4_ = 0xffffff82;
          auVar188._24_4_ = 0xffffff82;
          auVar188._28_4_ = 0xffffff82;
          auVar93 = vpaddd_avx2(auVar188,auVar116);
          auVar189._8_4_ = 0x3f3504f3;
          auVar189._0_8_ = 0x3f3504f33f3504f3;
          auVar189._12_4_ = 0x3f3504f3;
          auVar189._16_4_ = 0x3f3504f3;
          auVar189._20_4_ = 0x3f3504f3;
          auVar189._24_4_ = 0x3f3504f3;
          auVar189._28_4_ = 0x3f3504f3;
          auVar116 = vcmpps_avx(auVar61,auVar189,1);
          auVar83 = vandps_avx(auVar116,auVar61);
          auVar107._8_4_ = 0xbf800000;
          auVar107._0_8_ = 0xbf800000bf800000;
          auVar107._12_4_ = 0xbf800000;
          auVar107._16_4_ = 0xbf800000;
          auVar107._20_4_ = 0xbf800000;
          auVar107._24_4_ = 0xbf800000;
          auVar107._28_4_ = 0xbf800000;
          auVar98._0_4_ = auVar83._0_4_ + auVar61._0_4_ + -1.0;
          auVar98._4_4_ = auVar83._4_4_ + auVar61._4_4_ + -1.0;
          auVar98._8_4_ = auVar83._8_4_ + auVar61._8_4_ + -1.0;
          auVar98._12_4_ = auVar83._12_4_ + auVar61._12_4_ + -1.0;
          auVar98._16_4_ = auVar83._16_4_ + auVar61._16_4_ + -1.0;
          auVar98._20_4_ = auVar83._20_4_ + auVar61._20_4_ + -1.0;
          auVar98._24_4_ = auVar83._24_4_ + auVar61._24_4_ + -1.0;
          auVar98._28_4_ = auVar83._28_4_ + auVar61._28_4_ + -1.0;
          auVar61 = vcmpps_avx(ZEXT1632(auVar59),ZEXT832(0) << 0x20,2);
          auVar93 = vcvtdq2ps_avx(auVar93);
          auVar83 = vandps_avx(auVar116,auVar110);
          auVar83 = vsubps_avx(auVar93,auVar83);
          auVar190._8_4_ = 0x3d9021bb;
          auVar190._0_8_ = 0x3d9021bb3d9021bb;
          auVar190._12_4_ = 0x3d9021bb;
          auVar190._16_4_ = 0x3d9021bb;
          auVar190._20_4_ = 0x3d9021bb;
          auVar190._24_4_ = 0x3d9021bb;
          auVar190._28_4_ = 0x3d9021bb;
          auVar152._8_4_ = 0xbdebd1b8;
          auVar152._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar152._12_4_ = 0xbdebd1b8;
          auVar152._16_4_ = 0xbdebd1b8;
          auVar152._20_4_ = 0xbdebd1b8;
          auVar152._24_4_ = 0xbdebd1b8;
          auVar152._28_4_ = 0xbdebd1b8;
          auVar59 = vfmadd213ps_fma(auVar190,auVar98,auVar152);
          auVar153._8_4_ = 0x3def251a;
          auVar153._0_8_ = 0x3def251a3def251a;
          auVar153._12_4_ = 0x3def251a;
          auVar153._16_4_ = 0x3def251a;
          auVar153._20_4_ = 0x3def251a;
          auVar153._24_4_ = 0x3def251a;
          auVar153._28_4_ = 0x3def251a;
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar98,auVar153);
          auVar154._8_4_ = 0xbdfe5d4f;
          auVar154._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar154._12_4_ = 0xbdfe5d4f;
          auVar154._16_4_ = 0xbdfe5d4f;
          auVar154._20_4_ = 0xbdfe5d4f;
          auVar154._24_4_ = 0xbdfe5d4f;
          auVar154._28_4_ = 0xbdfe5d4f;
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar98,auVar154);
          auVar155._8_4_ = 0x3e11e9bf;
          auVar155._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar155._12_4_ = 0x3e11e9bf;
          auVar155._16_4_ = 0x3e11e9bf;
          auVar155._20_4_ = 0x3e11e9bf;
          auVar155._24_4_ = 0x3e11e9bf;
          auVar155._28_4_ = 0x3e11e9bf;
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar98,auVar155);
          auVar156._8_4_ = 0xbe2aae50;
          auVar156._0_8_ = 0xbe2aae50be2aae50;
          auVar156._12_4_ = 0xbe2aae50;
          auVar156._16_4_ = 0xbe2aae50;
          auVar156._20_4_ = 0xbe2aae50;
          auVar156._24_4_ = 0xbe2aae50;
          auVar156._28_4_ = 0xbe2aae50;
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar98,auVar156);
          auVar157._8_4_ = 0x3e4cceac;
          auVar157._0_8_ = 0x3e4cceac3e4cceac;
          auVar157._12_4_ = 0x3e4cceac;
          auVar157._16_4_ = 0x3e4cceac;
          auVar157._20_4_ = 0x3e4cceac;
          auVar157._24_4_ = 0x3e4cceac;
          auVar157._28_4_ = 0x3e4cceac;
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar98,auVar157);
          auVar158._8_4_ = 0xbe7ffffc;
          auVar158._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar158._12_4_ = 0xbe7ffffc;
          auVar158._16_4_ = 0xbe7ffffc;
          auVar158._20_4_ = 0xbe7ffffc;
          auVar158._24_4_ = 0xbe7ffffc;
          auVar158._28_4_ = 0xbe7ffffc;
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar98,auVar158);
          auVar159._8_4_ = 0x3eaaaaaa;
          auVar159._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar159._12_4_ = 0x3eaaaaaa;
          auVar159._16_4_ = 0x3eaaaaaa;
          auVar159._20_4_ = 0x3eaaaaaa;
          auVar159._24_4_ = 0x3eaaaaaa;
          auVar159._28_4_ = 0x3eaaaaaa;
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar98,auVar159);
          auVar60 = vfmsub213ps_fma(ZEXT1632(auVar59),auVar98,auVar102);
          auVar59 = vfmadd213ps_fma(auVar83,auVar139,auVar98);
          auVar11._4_4_ = auVar98._4_4_ * auVar98._4_4_;
          auVar11._0_4_ = auVar98._0_4_ * auVar98._0_4_;
          auVar11._8_4_ = auVar98._8_4_ * auVar98._8_4_;
          auVar11._12_4_ = auVar98._12_4_ * auVar98._12_4_;
          auVar11._16_4_ = auVar98._16_4_ * auVar98._16_4_;
          auVar11._20_4_ = auVar98._20_4_ * auVar98._20_4_;
          auVar11._24_4_ = auVar98._24_4_ * auVar98._24_4_;
          auVar11._28_4_ = auVar98._28_4_;
          auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar11,ZEXT1632(auVar60));
          auVar160._8_4_ = 0xc0000000;
          auVar160._0_8_ = 0xc0000000c0000000;
          auVar160._12_4_ = 0xc0000000;
          auVar160._16_4_ = 0xc0000000;
          auVar160._20_4_ = 0xc0000000;
          auVar160._24_4_ = 0xc0000000;
          auVar160._28_4_ = 0xc0000000;
          auVar12._4_4_ = auVar59._4_4_ * -2.0;
          auVar12._0_4_ = auVar59._0_4_ * -2.0;
          auVar12._8_4_ = auVar59._8_4_ * -2.0;
          auVar12._12_4_ = auVar59._12_4_ * -2.0;
          auVar12._16_4_ = 0x80000000;
          auVar12._20_4_ = 0x80000000;
          auVar12._24_4_ = 0x80000000;
          auVar12._28_4_ = auVar98._28_4_;
          auVar118._8_4_ = 0x7fffffff;
          auVar118._0_8_ = 0x7fffffff7fffffff;
          auVar118._12_4_ = 0x7fffffff;
          auVar118._16_4_ = 0x7fffffff;
          auVar118._20_4_ = 0x7fffffff;
          auVar118._24_4_ = 0x7fffffff;
          auVar118._28_4_ = 0x7fffffff;
          auVar83 = vblendvps_avx(auVar12,auVar118,auVar61);
          auVar99._8_4_ = 0x42b0c0a5;
          auVar99._0_8_ = 0x42b0c0a542b0c0a5;
          auVar99._12_4_ = 0x42b0c0a5;
          auVar99._16_4_ = 0x42b0c0a5;
          auVar99._20_4_ = 0x42b0c0a5;
          auVar99._24_4_ = 0x42b0c0a5;
          auVar99._28_4_ = 0x42b0c0a5;
          auVar83 = vminps_avx(auVar83,auVar99);
          auVar100._8_4_ = 0xc2b0c0a5;
          auVar100._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar100._12_4_ = 0xc2b0c0a5;
          auVar100._16_4_ = 0xc2b0c0a5;
          auVar100._20_4_ = 0xc2b0c0a5;
          auVar100._24_4_ = 0xc2b0c0a5;
          auVar100._28_4_ = 0xc2b0c0a5;
          auVar116 = vmaxps_avx(auVar83,auVar100);
          auVar59 = vfmadd213ps_fma(auVar170,auVar116,auVar102);
          auVar61 = vroundps_avx(ZEXT1632(auVar59),1);
          auVar83 = vcmpps_avx(ZEXT1632(auVar59),auVar61,1);
          auVar83 = vandps_avx(auVar83,auVar110);
          auVar83 = vsubps_avx(auVar61,auVar83);
          auVar60 = vfnmadd231ps_fma(auVar116,auVar83,auVar139);
          auVar116 = ZEXT1632(auVar60);
          fVar120 = auVar60._0_4_;
          fVar121 = auVar60._4_4_;
          fVar92 = auVar60._8_4_;
          fVar122 = auVar60._12_4_;
          auVar13._28_4_ = auVar61._28_4_;
          auVar13._0_28_ =
               ZEXT1628(CONCAT412(fVar122 * fVar122,
                                  CONCAT48(fVar92 * fVar92,
                                           CONCAT44(fVar121 * fVar121,fVar120 * fVar120))));
          auVar59 = vfmadd213ps_fma(auVar176,auVar116,auVar174);
          auVar177 = ZEXT3264(auVar102);
          auVar56 = ZEXT864(0) << 0x20;
          auVar140._8_4_ = 0x3c088908;
          auVar140._0_8_ = 0x3c0889083c088908;
          auVar140._12_4_ = 0x3c088908;
          auVar140._16_4_ = 0x3c088908;
          auVar140._20_4_ = 0x3c088908;
          auVar140._24_4_ = 0x3c088908;
          auVar140._28_4_ = 0x3c088908;
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar116,auVar140);
          auVar141._8_4_ = 0x3d2aa9c1;
          auVar141._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar141._12_4_ = 0x3d2aa9c1;
          auVar141._16_4_ = 0x3d2aa9c1;
          auVar141._20_4_ = 0x3d2aa9c1;
          auVar141._24_4_ = 0x3d2aa9c1;
          auVar141._28_4_ = 0x3d2aa9c1;
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),auVar116,auVar141);
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),ZEXT1632(auVar60),auVar130);
          auVar59 = vfmadd213ps_fma(ZEXT1632(auVar59),ZEXT1632(auVar60),auVar102);
          auVar84._0_4_ = fVar120 + 1.0;
          auVar84._4_4_ = fVar121 + 1.0;
          auVar84._8_4_ = fVar92 + 1.0;
          auVar84._12_4_ = fVar122 + 1.0;
          auVar84._16_4_ = 0x3f800000;
          auVar84._20_4_ = 0x3f800000;
          auVar84._24_4_ = 0x3f800000;
          auVar84._28_4_ = 0x3f800000;
          auVar59 = vfmadd231ps_fma(auVar84,auVar13,ZEXT1632(auVar59));
          auVar101._0_4_ = (int)auVar83._0_4_;
          auVar101._4_4_ = (int)auVar83._4_4_;
          auVar101._8_4_ = (int)auVar83._8_4_;
          auVar101._12_4_ = (int)auVar83._12_4_;
          auVar101._16_4_ = (int)auVar83._16_4_;
          auVar101._20_4_ = (int)auVar83._20_4_;
          auVar101._24_4_ = (int)auVar83._24_4_;
          auVar101._28_4_ = (int)auVar83._28_4_;
          auVar102 = vpslld_avx2(auVar101,0x17);
          auVar102 = vpaddd_avx2(auVar102,auVar66);
          auVar59 = vfmadd213ps_fma(auVar102,ZEXT1632(auVar59),auVar110);
          auVar102 = vrcpps_avx(ZEXT1632(auVar59));
          auVar59 = vfmsub213ps_fma(ZEXT1632(auVar59),auVar102,auVar110);
          auVar59 = vfnmadd132ps_fma(ZEXT1632(auVar59),auVar102,auVar102);
          auVar59 = vfnmadd213ps_fma(ZEXT1632(auVar59),auVar160,auVar107);
          goto LAB_001e6a22;
        case 6:
          uVar3 = **(undefined4 **)(p_Var8 + 0x40 + (long)&(this->weight_data_int8).data);
          auVar70._4_4_ = uVar3;
          auVar70._0_4_ = uVar3;
          auVar70._8_4_ = uVar3;
          auVar70._12_4_ = uVar3;
          auVar70._16_4_ = uVar3;
          auVar70._20_4_ = uVar3;
          auVar70._24_4_ = uVar3;
          auVar70._28_4_ = uVar3;
          uVar3 = (*(undefined4 **)(p_Var8 + 0x40 + (long)&(this->weight_data_int8).data))[1];
          auVar90._4_4_ = uVar3;
          auVar90._0_4_ = uVar3;
          auVar90._8_4_ = uVar3;
          auVar90._12_4_ = uVar3;
          auVar90._16_4_ = uVar3;
          auVar90._20_4_ = uVar3;
          auVar90._24_4_ = uVar3;
          auVar90._28_4_ = uVar3;
          auVar59 = vfmadd231ps_fma(auVar90,auVar181,auVar70);
          auVar102 = vmaxps_avx(ZEXT1632(auVar59),auVar61);
          auVar102 = vminps_avx(auVar102,auVar110);
          auVar59 = auVar102._0_16_;
LAB_001e6a22:
          auVar58._0_4_ = fVar57 * auVar59._0_4_;
          auVar58._4_4_ = fVar72 * auVar59._4_4_;
          auVar58._8_4_ = auVar58._8_4_ * auVar59._8_4_;
          auVar58._12_4_ = auVar58._12_4_ * auVar59._12_4_;
        }
        *(undefined1 (*) [16])((long)pvVar5 + uVar2 * 4) = auVar58;
        uVar37 = uVar37 + 1;
      } while (uVar37 != uVar35);
    }
    p_Var8 = pp_Var6[-3];
    if (iVar23 < *(int *)(p_Var8 + 0x28 + (long)&(this->weight_data_int8).data)) {
      lVar30 = (long)iVar23;
      do {
        fVar57 = 0.0;
        if (*(int *)(p_Var8 + 0x2c + (long)&(this->weight_data_int8).data) != 0) {
          fVar57 = *(float *)(*(long *)(&this->field_0x178 + (long)p_Var8) + lVar30 * 4);
        }
        pauVar26 = (undefined1 (*) [16])((long)pvVar7 + lVar30 * lVar28 * 2);
        auVar58 = ZEXT816(0) << 0x40;
        pauVar29 = pauVar22;
        iVar23 = uVar41 + 1;
        if (0 < (int)uVar41) {
          do {
            auVar59 = vlddqu_avx(*pauVar26);
            auVar102 = vcvtph2ps_f16c(auVar59);
            auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar102,*pauVar29);
            pauVar29 = pauVar29 + 1;
            pauVar26 = pauVar26 + 1;
            iVar23 = iVar23 + -1;
          } while (1 < iVar23);
        }
        auVar102 = ZEXT1632(auVar58);
        if ((ulong)(uVar24 & 7) != 0) {
          local_138._0_16_ = ZEXT816(0);
          local_b8 = ZEXT816(0);
          _local_b8 = ZEXT1632(local_b8);
          uVar27 = 0;
          do {
            *(undefined4 *)(local_b8 + uVar27 * 4) = *(undefined4 *)(*pauVar29 + uVar27 * 4);
            *(undefined2 *)(local_138 + uVar27 * 2) = *(undefined2 *)(*pauVar26 + uVar27 * 2);
            uVar27 = uVar27 + 1;
          } while ((uVar24 & 7) != uVar27);
          auVar58 = vlddqu_avx(local_138._0_16_);
          auVar83 = vcvtph2ps_f16c(auVar58);
          auVar58 = vfmadd231ps_fma(auVar102,auVar83,_local_b8);
          auVar102 = ZEXT1632(auVar58);
        }
        auVar59._0_4_ = auVar102._16_4_ + auVar102._0_4_;
        auVar59._4_4_ = auVar102._20_4_ + auVar102._4_4_;
        auVar59._8_4_ = auVar102._24_4_ + auVar102._8_4_;
        auVar59._12_4_ = auVar102._28_4_ + auVar102._12_4_;
        auVar58 = vshufpd_avx(auVar59,auVar59,1);
        auVar60._0_4_ = auVar58._0_4_ + auVar59._0_4_;
        auVar60._4_4_ = auVar58._4_4_ + auVar59._4_4_;
        auVar60._8_4_ = auVar58._8_4_ + auVar59._8_4_;
        auVar60._12_4_ = auVar58._12_4_ + auVar59._12_4_;
        auVar58 = vmovshdup_avx(auVar60);
        fVar57 = auVar58._0_4_ + fVar57 + auVar60._0_4_;
        p_Var8 = pp_Var6[-3];
        auVar58 = ZEXT416((uint)fVar57);
        fVar72 = fVar57;
        switch(*(undefined4 *)(p_Var8 + 0x38 + (long)&(this->weight_data_int8).data)) {
        case 1:
          auVar58 = vmaxss_avx(auVar58,ZEXT416(0));
          fVar72 = auVar58._0_4_;
          break;
        case 2:
          auVar55._0_12_ = ZEXT812(0);
          auVar55._12_4_ = 0;
          auVar58 = vcmpss_avx(auVar55,auVar58,1);
          auVar73._8_4_ = 0x3f800000;
          auVar73._0_8_ = 0x3f8000003f800000;
          auVar73._12_4_ = 0x3f800000;
          auVar58 = vblendvps_avx(ZEXT416(**(uint **)(p_Var8 + 0x40 +
                                                     (long)&(this->weight_data_int8).data)),auVar73,
                                  auVar58);
          fVar72 = auVar58._0_4_ * fVar57;
          break;
        case 3:
          auVar58 = vmaxss_avx(auVar58,ZEXT416(**(uint **)(p_Var8 + 0x40 +
                                                          (long)&(this->weight_data_int8).data)));
          auVar58 = vminss_avx(auVar58,ZEXT416((*(uint **)(p_Var8 + 0x40 +
                                                          (long)&(this->weight_data_int8).data))[1])
                              );
          fVar72 = auVar58._0_4_;
          break;
        case 4:
          fVar57 = expf(-fVar57);
          fVar72 = 1.0 / (fVar57 + 1.0);
          break;
        case 5:
          local_148 = auVar58;
          fVar57 = expf(fVar57);
          fVar57 = logf(fVar57 + 1.0);
          fVar57 = tanhf(fVar57);
          fVar72 = fVar57 * (float)local_148._0_4_;
          break;
        case 6:
          fVar120 = **(float **)(p_Var8 + 0x40 + (long)&(this->weight_data_int8).data);
          fVar121 = (*(float **)(p_Var8 + 0x40 + (long)&(this->weight_data_int8).data))[1];
          fVar92 = -fVar121 / fVar120;
          fVar72 = 0.0;
          if ((fVar92 <= fVar57) && (fVar72 = fVar57, fVar57 <= fVar92 + 1.0 / fVar120)) {
            auVar58 = vfmadd213ss_fma(ZEXT416((uint)fVar120),auVar58,ZEXT416((uint)fVar121));
            fVar72 = auVar58._0_4_ * fVar57;
          }
        }
        *(float *)((long)pvVar5 + lVar30 * 4) = fVar72;
        lVar30 = lVar30 + 1;
        p_Var8 = pp_Var6[-3];
      } while (lVar30 < *(int *)(p_Var8 + 0x28 + (long)&(this->weight_data_int8).data));
    }
    iVar23 = 0;
  }
  piVar4 = (int *)CONCAT44(uStack_18c,uStack_190);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_178 == (Allocator *)0x0) {
        if (local_198 != (undefined1 (*) [32])0x0) {
          free(local_198);
        }
      }
      else {
        (*local_178->_vptr_Allocator[3])();
      }
    }
  }
  return iVar23;
}

Assistant:

int InnerProduct_x86_avx2::forward_fp16(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    // pack1
    {
        bottom_blob_flattened.w *= bottom_blob_flattened.elempack;
        bottom_blob_flattened.cstep = bottom_blob_flattened.w;
        bottom_blob_flattened.elemsize = 4u;
        bottom_blob_flattened.elempack = 1;
    }

    int w = bottom_blob_flattened.w;
    int h = bottom_blob_flattened.h;
    size_t elemsize = bottom_blob_flattened.elemsize;
    int size = w * h;
    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const unsigned short* weight_data_ptr = (const unsigned short*)weight_data_fp16;
    float* output_ptr = top_blob;
    int nn_num_output = num_output >> 3;
    int remain_num_output_start = nn_num_output << 3;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_num_output; pp++)
    {
        int p = pp * 8;

        float sums[8] = {0.0f};
        if (bias_term)
        {
            sums[0] = bias_data[p];
            sums[1] = bias_data[p + 1];
            sums[2] = bias_data[p + 2];
            sums[3] = bias_data[p + 3];
            sums[4] = bias_data[p + 4];
            sums[5] = bias_data[p + 5];
            sums[6] = bias_data[p + 6];
            sums[7] = bias_data[p + 7];
        }
        __m256 _sum0 = _mm256_set1_ps(0.f);
        __m256 _sum1 = _mm256_set1_ps(0.f);
        __m256 _sum2 = _mm256_set1_ps(0.f);
        __m256 _sum3 = _mm256_set1_ps(0.f);
        __m256 _sum4 = _mm256_set1_ps(0.f);
        __m256 _sum5 = _mm256_set1_ps(0.f);
        __m256 _sum6 = _mm256_set1_ps(0.f);
        __m256 _sum7 = _mm256_set1_ps(0.f);

        const unsigned short* w0 = (const unsigned short*)weight_data_ptr + size * p;
        const unsigned short* w1 = (const unsigned short*)weight_data_ptr + size * (p + 1);
        const unsigned short* w2 = (const unsigned short*)weight_data_ptr + size * (p + 2);
        const unsigned short* w3 = (const unsigned short*)weight_data_ptr + size * (p + 3);
        const unsigned short* w4 = (const unsigned short*)weight_data_ptr + size * (p + 4);
        const unsigned short* w5 = (const unsigned short*)weight_data_ptr + size * (p + 5);
        const unsigned short* w6 = (const unsigned short*)weight_data_ptr + size * (p + 6);
        const unsigned short* w7 = (const unsigned short*)weight_data_ptr + size * (p + 7);

        const float* m = bottom_blob_flattened;
        int nn = size >> 3;
        int remain = size & 7;

        for (; nn > 0; nn--)
        {
            __m256 _m = _mm256_loadu_ps(m);

            __m256 _w0 = loadfp16(w0);
            _sum0 = _mm256_comp_fmadd_ps(_m, _w0, _sum0);

            __m256 _w1 = loadfp16(w1);
            _sum1 = _mm256_comp_fmadd_ps(_m, _w1, _sum1);

            __m256 _w2 = loadfp16(w2);
            _sum2 = _mm256_comp_fmadd_ps(_m, _w2, _sum2);

            __m256 _w3 = loadfp16(w3);
            _sum3 = _mm256_comp_fmadd_ps(_m, _w3, _sum3);

            __m256 _w4 = loadfp16(w4);
            _sum4 = _mm256_comp_fmadd_ps(_m, _w4, _sum4);

            __m256 _w5 = loadfp16(w5);
            _sum5 = _mm256_comp_fmadd_ps(_m, _w5, _sum5);

            __m256 _w6 = loadfp16(w6);
            _sum6 = _mm256_comp_fmadd_ps(_m, _w6, _sum6);

            __m256 _w7 = loadfp16(w7);
            _sum7 = _mm256_comp_fmadd_ps(_m, _w7, _sum7);

            m += 8;
            w0 += 8;
            w1 += 8;
            w2 += 8;
            w3 += 8;
            w4 += 8;
            w5 += 8;
            w6 += 8;
            w7 += 8;
        }
        if (remain != 0)
        {
            unsigned short fp16_weights[8][8] = {{0}};
            float _m_f[8] = {0};
            int i = 0;
            // No fast way to convert to fp32 one element at the time
            // so batch an 8 lane vector.
            for (; remain > 0; remain--)
            {
                _m_f[i] = *m;
                fp16_weights[0][i] = *w0;
                fp16_weights[1][i] = *w1;
                fp16_weights[2][i] = *w2;
                fp16_weights[3][i] = *w3;
                fp16_weights[4][i] = *w4;
                fp16_weights[5][i] = *w5;
                fp16_weights[6][i] = *w6;
                fp16_weights[7][i] = *w7;
                i++;
                m++;
                w0++;
                w1++;
                w2++;
                w3++;
                w4++;
                w5++;
                w6++;
                w7++;
            }
            __m256 _m = _mm256_loadu_ps(_m_f);

            __m256 _w0 = loadfp16(fp16_weights[0]);
            _sum0 = _mm256_comp_fmadd_ps(_m, _w0, _sum0);

            __m256 _w1 = loadfp16(fp16_weights[1]);
            _sum1 = _mm256_comp_fmadd_ps(_m, _w1, _sum1);

            __m256 _w2 = loadfp16(fp16_weights[2]);
            _sum2 = _mm256_comp_fmadd_ps(_m, _w2, _sum2);

            __m256 _w3 = loadfp16(fp16_weights[3]);
            _sum3 = _mm256_comp_fmadd_ps(_m, _w3, _sum3);

            __m256 _w4 = loadfp16(fp16_weights[4]);
            _sum4 = _mm256_comp_fmadd_ps(_m, _w4, _sum4);

            __m256 _w5 = loadfp16(fp16_weights[5]);
            _sum5 = _mm256_comp_fmadd_ps(_m, _w5, _sum5);

            __m256 _w6 = loadfp16(fp16_weights[6]);
            _sum6 = _mm256_comp_fmadd_ps(_m, _w6, _sum6);

            __m256 _w7 = loadfp16(fp16_weights[7]);
            _sum7 = _mm256_comp_fmadd_ps(_m, _w7, _sum7);
        }

        __m256 _sums = HorizontalSums(_sum0, _sum1, _sum2, _sum3, _sum4, _sum5, _sum6, _sum7);
        __m256 _sums_f = _mm256_loadu_ps(sums);
        _sums = activation_avx(_mm256_add_ps(_sums_f, _sums), activation_type, activation_params);
        _mm256_storeu_ps(output_ptr + p, _sums);
    }

    nn_num_output = (num_output - remain_num_output_start) >> 2;
    int nn_offset = remain_num_output_start;
    remain_num_output_start += (nn_num_output << 2);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_num_output; pp++)
    {
        int p = nn_offset + (pp * 4);

        float sums[4] = {0.0f};
        if (bias_term)
        {
            sums[0] = bias_data[p];
            sums[1] = bias_data[p + 1];
            sums[2] = bias_data[p + 2];
            sums[3] = bias_data[p + 3];
        }
        __m256 _sum0 = _mm256_set1_ps(0.f);
        __m256 _sum1 = _mm256_set1_ps(0.f);
        __m256 _sum2 = _mm256_set1_ps(0.f);
        __m256 _sum3 = _mm256_set1_ps(0.f);

        const unsigned short* w0 = (const unsigned short*)weight_data_ptr + size * p;
        const unsigned short* w1 = (const unsigned short*)weight_data_ptr + size * (p + 1);
        const unsigned short* w2 = (const unsigned short*)weight_data_ptr + size * (p + 2);
        const unsigned short* w3 = (const unsigned short*)weight_data_ptr + size * (p + 3);

        const float* m = bottom_blob_flattened;
        int nn = size >> 3;
        int remain = size & 7;

        for (; nn > 0; nn--)
        {
            __m256 _m = _mm256_loadu_ps(m);

            __m256 _w0 = loadfp16(w0);
            _sum0 = _mm256_comp_fmadd_ps(_m, _w0, _sum0);

            __m256 _w1 = loadfp16(w1);
            _sum1 = _mm256_comp_fmadd_ps(_m, _w1, _sum1);

            __m256 _w2 = loadfp16(w2);
            _sum2 = _mm256_comp_fmadd_ps(_m, _w2, _sum2);

            __m256 _w3 = loadfp16(w3);
            _sum3 = _mm256_comp_fmadd_ps(_m, _w3, _sum3);

            m += 8;
            w0 += 8;
            w1 += 8;
            w2 += 8;
            w3 += 8;
        }
        if (remain != 0)
        {
            unsigned short fp16_weights[4][8] = {{0}};
            float _m_f[8] = {0};
            int i = 0;
            for (; remain > 0; remain--)
            {
                _m_f[i] = *m;
                fp16_weights[0][i] = *w0;
                fp16_weights[1][i] = *w1;
                fp16_weights[2][i] = *w2;
                fp16_weights[3][i] = *w3;
                i++;
                m++;
                w0++;
                w1++;
                w2++;
                w3++;
            }
            __m256 _m = _mm256_loadu_ps(_m_f);

            __m256 _w0 = loadfp16(fp16_weights[0]);
            _sum0 = _mm256_comp_fmadd_ps(_m, _w0, _sum0);

            __m256 _w1 = loadfp16(fp16_weights[1]);
            _sum1 = _mm256_comp_fmadd_ps(_m, _w1, _sum1);

            __m256 _w2 = loadfp16(fp16_weights[2]);
            _sum2 = _mm256_comp_fmadd_ps(_m, _w2, _sum2);

            __m256 _w3 = loadfp16(fp16_weights[3]);
            _sum3 = _mm256_comp_fmadd_ps(_m, _w3, _sum3);
        }

        __m128 _sums = HorizontalSums(_sum0, _sum1, _sum2, _sum3);
        __m256 _sums_a = activation_avx(_mm256_castps128_ps256(_mm_add_ps(_mm_loadu_ps(sums), _sums)), activation_type, activation_params);
        _mm_storeu_ps(output_ptr + p, _mm256_castps256_ps128(_sums_a));
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_num_output_start; p < num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        const unsigned short* w = (const unsigned short*)weight_data_ptr + size * p;

        __m256 _sum = _mm256_set1_ps(0.f);

        const float* m = bottom_blob_flattened;

        int nn = size >> 3;
        int remain = size & 7;
        for (; nn > 0; nn--)
        {
            __m256 _m = _mm256_loadu_ps(m);

            __m256 _w = loadfp16(w);
            _sum = _mm256_comp_fmadd_ps(_m, _w, _sum);

            m += 8;
            w += 8;
        }
        if (remain != 0)
        {
            unsigned short fp16_weights[8] = {0};
            float _m_f[8] = {0};
            int i = 0;
            for (; remain > 0; remain--)
            {
                _m_f[i] = *m;
                fp16_weights[i] = *w;
                i++;
                m++;
                w++;
            }
            __m256 _m = _mm256_loadu_ps(_m_f);

            __m256 _w = loadfp16(fp16_weights);
            _sum = _mm256_comp_fmadd_ps(_m, _w, _sum);
        }

        sum += _mm256_reduce_add_ps(_sum);
        sum = activation_ss(sum, activation_type, activation_params);

        output_ptr[p] = sum;
    }
    return 0;
}